

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

void embree::avx2::CurveNvIntersector1<8>::
     intersect_t<embree::avx2::SweepCurve1Intersector1<embree::BSplineCurveT>,embree::avx2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Primitive PVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  int iVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  bool bVar65;
  undefined1 auVar66 [12];
  bool bVar67;
  bool bVar68;
  bool bVar69;
  bool bVar70;
  bool bVar71;
  bool bVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  uint uVar96;
  ulong uVar97;
  uint uVar98;
  ulong uVar99;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined4 uVar100;
  ulong uVar101;
  long lVar102;
  bool bVar103;
  float fVar104;
  float fVar131;
  float fVar132;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar134;
  float fVar135;
  float fVar136;
  undefined1 auVar116 [32];
  float fVar133;
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 extraout_var [60];
  undefined1 auVar130 [64];
  undefined1 extraout_var_00 [60];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar161;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  float fVar179;
  float fVar180;
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  float fVar181;
  undefined1 auVar177 [64];
  undefined1 auVar178 [64];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  float fVar201;
  float fVar214;
  float fVar216;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  float fVar212;
  float fVar213;
  undefined1 auVar208 [32];
  float fVar215;
  undefined1 auVar209 [32];
  undefined1 auVar207 [16];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [64];
  undefined1 auVar232 [32];
  undefined1 auVar226 [32];
  undefined8 uVar227;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  float fVar235;
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [64];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  float fVar251;
  undefined1 auVar244 [16];
  float fVar243;
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  float fVar249;
  float fVar250;
  float fVar252;
  float fVar253;
  float fVar254;
  undefined1 auVar247 [32];
  undefined1 auVar248 [64];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  float fVar260;
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 in_ZMM10 [64];
  undefined1 auVar259 [64];
  undefined1 auVar261 [16];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [64];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  float fVar265;
  undefined1 auVar272 [32];
  float fVar274;
  float fVar275;
  float fVar276;
  float fVar277;
  float fVar278;
  float fVar279;
  undefined1 in_ZMM12 [64];
  undefined1 auVar273 [64];
  undefined4 uVar283;
  undefined4 uVar284;
  float fVar285;
  float fVar286;
  float fVar287;
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [64];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  int local_b0c;
  ulong local_b08;
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  RTCFilterFunctionNArguments local_a90;
  undefined1 local_a60 [32];
  undefined1 local_a40 [8];
  float fStack_a38;
  float fStack_a34;
  undefined1 local_a30 [16];
  undefined1 local_a20 [16];
  undefined1 local_a10 [16];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined8 local_9b0;
  float local_9a8;
  float local_9a4;
  undefined4 local_9a0;
  uint local_99c;
  uint local_998;
  uint local_994;
  uint local_990;
  undefined1 local_980 [32];
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  undefined1 auStack_950 [16];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_8a0 [32];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined1 local_7f0 [16];
  Primitive *local_7d8;
  Primitive *local_7d0;
  ulong local_7c8;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [32];
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  uint local_640;
  uint uStack_63c;
  uint uStack_638;
  uint uStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  uint uStack_624;
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined4 local_400;
  undefined4 uStack_3fc;
  undefined4 uStack_3f8;
  undefined4 uStack_3f4;
  undefined4 uStack_3f0;
  undefined4 uStack_3ec;
  undefined4 uStack_3e8;
  undefined4 uStack_3e4;
  undefined4 local_3e0;
  undefined4 uStack_3dc;
  undefined4 uStack_3d8;
  undefined4 uStack_3d4;
  undefined4 uStack_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  undefined4 local_3c0;
  undefined4 uStack_3bc;
  undefined4 uStack_3b8;
  undefined4 uStack_3b4;
  undefined4 uStack_3b0;
  undefined4 uStack_3ac;
  undefined4 uStack_3a8;
  undefined4 uStack_3a4;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar292 [32];
  
  PVar6 = prim[1];
  uVar101 = (ulong)(byte)PVar6;
  lVar102 = uVar101 * 0x19;
  fVar201 = *(float *)(prim + lVar102 + 0x12);
  auVar112 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + lVar102 + 6));
  auVar105._0_4_ = fVar201 * auVar112._0_4_;
  auVar105._4_4_ = fVar201 * auVar112._4_4_;
  auVar105._8_4_ = fVar201 * auVar112._8_4_;
  auVar105._12_4_ = fVar201 * auVar112._12_4_;
  auVar228._0_4_ = fVar201 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar228._4_4_ = fVar201 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar228._8_4_ = fVar201 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar228._12_4_ = fVar201 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar112._8_8_ = 0;
  auVar112._0_8_ = *(ulong *)(prim + uVar101 * 4 + 6);
  auVar124 = vpmovsxbd_avx2(auVar112);
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar244._8_8_ = 0;
  auVar244._0_8_ = *(ulong *)(prim + uVar101 * 5 + 6);
  auVar116 = vpmovsxbd_avx2(auVar244);
  auVar116 = vcvtdq2ps_avx(auVar116);
  auVar256._8_8_ = 0;
  auVar256._0_8_ = *(ulong *)(prim + uVar101 * 6 + 6);
  auVar9 = vpmovsxbd_avx2(auVar256);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar139._8_8_ = 0;
  auVar139._0_8_ = *(ulong *)(prim + uVar101 * 0xb + 6);
  auVar10 = vpmovsxbd_avx2(auVar139);
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar6 * 0xc) + 6);
  auVar11 = vpmovsxbd_avx2(auVar3);
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar165._8_8_ = 0;
  auVar165._0_8_ = *(ulong *)(prim + (uint)(byte)PVar6 * 0xc + uVar101 + 6);
  auVar149 = vpmovsxbd_avx2(auVar165);
  auVar149 = vcvtdq2ps_avx(auVar149);
  uVar97 = (ulong)(uint)((int)(uVar101 * 9) * 2);
  auVar144._8_8_ = 0;
  auVar144._0_8_ = *(ulong *)(prim + uVar97 + 6);
  auVar232 = vpmovsxbd_avx2(auVar144);
  auVar232 = vcvtdq2ps_avx(auVar232);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar97 + uVar101 + 6);
  auVar12 = vpmovsxbd_avx2(auVar4);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar264 = ZEXT3264(auVar12);
  uVar97 = (ulong)(uint)((int)(uVar101 * 5) << 2);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar97 + 6);
  auVar13 = vpmovsxbd_avx2(auVar5);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar288._4_4_ = auVar228._0_4_;
  auVar288._0_4_ = auVar228._0_4_;
  auVar288._8_4_ = auVar228._0_4_;
  auVar288._12_4_ = auVar228._0_4_;
  auVar288._16_4_ = auVar228._0_4_;
  auVar288._20_4_ = auVar228._0_4_;
  auVar288._24_4_ = auVar228._0_4_;
  auVar288._28_4_ = auVar228._0_4_;
  auVar112 = vmovshdup_avx(auVar228);
  uVar227 = auVar112._0_8_;
  auVar291._8_8_ = uVar227;
  auVar291._0_8_ = uVar227;
  auVar291._16_8_ = uVar227;
  auVar291._24_8_ = uVar227;
  auVar112 = vshufps_avx(auVar228,auVar228,0xaa);
  fVar201 = auVar112._0_4_;
  auVar273._0_4_ = fVar201 * auVar9._0_4_;
  fVar212 = auVar112._4_4_;
  auVar273._4_4_ = fVar212 * auVar9._4_4_;
  auVar273._8_4_ = fVar201 * auVar9._8_4_;
  auVar273._12_4_ = fVar212 * auVar9._12_4_;
  auVar273._16_4_ = fVar201 * auVar9._16_4_;
  auVar273._20_4_ = fVar212 * auVar9._20_4_;
  auVar273._28_36_ = in_ZMM12._28_36_;
  auVar273._24_4_ = fVar201 * auVar9._24_4_;
  auVar259._0_4_ = auVar149._0_4_ * fVar201;
  auVar259._4_4_ = auVar149._4_4_ * fVar212;
  auVar259._8_4_ = auVar149._8_4_ * fVar201;
  auVar259._12_4_ = auVar149._12_4_ * fVar212;
  auVar259._16_4_ = auVar149._16_4_ * fVar201;
  auVar259._20_4_ = auVar149._20_4_ * fVar212;
  auVar259._28_36_ = in_ZMM10._28_36_;
  auVar259._24_4_ = auVar149._24_4_ * fVar201;
  auVar247._0_4_ = auVar13._0_4_ * fVar201;
  auVar247._4_4_ = auVar13._4_4_ * fVar212;
  auVar247._8_4_ = auVar13._8_4_ * fVar201;
  auVar247._12_4_ = auVar13._12_4_ * fVar212;
  auVar247._16_4_ = auVar13._16_4_ * fVar201;
  auVar247._20_4_ = auVar13._20_4_ * fVar212;
  auVar247._24_4_ = auVar13._24_4_ * fVar201;
  auVar247._28_4_ = 0;
  auVar112 = vfmadd231ps_fma(auVar273._0_32_,auVar291,auVar116);
  auVar244 = vfmadd231ps_fma(auVar259._0_32_,auVar291,auVar11);
  auVar256 = vfmadd231ps_fma(auVar247,auVar12,auVar291);
  auVar139 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar288,auVar124);
  auVar273 = ZEXT1664(auVar139);
  auVar244 = vfmadd231ps_fma(ZEXT1632(auVar244),auVar288,auVar10);
  auVar259 = ZEXT1664(auVar244);
  auVar256 = vfmadd231ps_fma(ZEXT1632(auVar256),auVar232,auVar288);
  auVar289._4_4_ = auVar105._0_4_;
  auVar289._0_4_ = auVar105._0_4_;
  auVar289._8_4_ = auVar105._0_4_;
  auVar289._12_4_ = auVar105._0_4_;
  auVar289._16_4_ = auVar105._0_4_;
  auVar289._20_4_ = auVar105._0_4_;
  auVar289._24_4_ = auVar105._0_4_;
  auVar289._28_4_ = auVar105._0_4_;
  auVar112 = vmovshdup_avx(auVar105);
  uVar227 = auVar112._0_8_;
  auVar292._8_8_ = uVar227;
  auVar292._0_8_ = uVar227;
  auVar292._16_8_ = uVar227;
  auVar292._24_8_ = uVar227;
  auVar294 = ZEXT3264(auVar292);
  auVar112 = vshufps_avx(auVar105,auVar105,0xaa);
  fVar201 = auVar112._0_4_;
  auVar230._0_4_ = fVar201 * auVar9._0_4_;
  fVar212 = auVar112._4_4_;
  auVar230._4_4_ = fVar212 * auVar9._4_4_;
  auVar230._8_4_ = fVar201 * auVar9._8_4_;
  auVar230._12_4_ = fVar212 * auVar9._12_4_;
  auVar230._16_4_ = fVar201 * auVar9._16_4_;
  auVar230._20_4_ = fVar212 * auVar9._20_4_;
  auVar230._24_4_ = fVar201 * auVar9._24_4_;
  auVar230._28_4_ = 0;
  auVar123._4_4_ = auVar149._4_4_ * fVar212;
  auVar123._0_4_ = auVar149._0_4_ * fVar201;
  auVar123._8_4_ = auVar149._8_4_ * fVar201;
  auVar123._12_4_ = auVar149._12_4_ * fVar212;
  auVar123._16_4_ = auVar149._16_4_ * fVar201;
  auVar123._20_4_ = auVar149._20_4_ * fVar212;
  auVar123._24_4_ = auVar149._24_4_ * fVar201;
  auVar123._28_4_ = auVar9._28_4_;
  auVar9._4_4_ = auVar13._4_4_ * fVar212;
  auVar9._0_4_ = auVar13._0_4_ * fVar201;
  auVar9._8_4_ = auVar13._8_4_ * fVar201;
  auVar9._12_4_ = auVar13._12_4_ * fVar212;
  auVar9._16_4_ = auVar13._16_4_ * fVar201;
  auVar9._20_4_ = auVar13._20_4_ * fVar212;
  auVar9._24_4_ = auVar13._24_4_ * fVar201;
  auVar9._28_4_ = fVar212;
  auVar112 = vfmadd231ps_fma(auVar230,auVar292,auVar116);
  auVar3 = vfmadd231ps_fma(auVar123,auVar292,auVar11);
  auVar165 = vfmadd231ps_fma(auVar9,auVar292,auVar12);
  auVar144 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar289,auVar124);
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar289,auVar10);
  local_7c0._8_4_ = 0x7fffffff;
  local_7c0._0_8_ = 0x7fffffff7fffffff;
  local_7c0._12_4_ = 0x7fffffff;
  local_7c0._16_4_ = 0x7fffffff;
  local_7c0._20_4_ = 0x7fffffff;
  local_7c0._24_4_ = 0x7fffffff;
  local_7c0._28_4_ = 0x7fffffff;
  auVar236._8_4_ = 0x219392ef;
  auVar236._0_8_ = 0x219392ef219392ef;
  auVar236._12_4_ = 0x219392ef;
  auVar236._16_4_ = 0x219392ef;
  auVar236._20_4_ = 0x219392ef;
  auVar236._24_4_ = 0x219392ef;
  auVar236._28_4_ = 0x219392ef;
  auVar124 = vandps_avx(ZEXT1632(auVar139),local_7c0);
  auVar124 = vcmpps_avx(auVar124,auVar236,1);
  auVar116 = vblendvps_avx(ZEXT1632(auVar139),auVar236,auVar124);
  auVar124 = vandps_avx(ZEXT1632(auVar244),local_7c0);
  auVar124 = vcmpps_avx(auVar124,auVar236,1);
  auVar9 = vblendvps_avx(ZEXT1632(auVar244),auVar236,auVar124);
  auVar124 = vandps_avx(ZEXT1632(auVar256),local_7c0);
  auVar124 = vcmpps_avx(auVar124,auVar236,1);
  auVar124 = vblendvps_avx(ZEXT1632(auVar256),auVar236,auVar124);
  auVar139 = vfmadd231ps_fma(ZEXT1632(auVar165),auVar289,auVar232);
  auVar10 = vrcpps_avx(auVar116);
  auVar223._8_4_ = 0x3f800000;
  auVar223._0_8_ = &DAT_3f8000003f800000;
  auVar223._12_4_ = 0x3f800000;
  auVar223._16_4_ = 0x3f800000;
  auVar223._20_4_ = 0x3f800000;
  auVar223._24_4_ = 0x3f800000;
  auVar223._28_4_ = 0x3f800000;
  auVar112 = vfnmadd213ps_fma(auVar116,auVar10,auVar223);
  auVar112 = vfmadd132ps_fma(ZEXT1632(auVar112),auVar10,auVar10);
  auVar116 = vrcpps_avx(auVar9);
  auVar244 = vfnmadd213ps_fma(auVar9,auVar116,auVar223);
  auVar244 = vfmadd132ps_fma(ZEXT1632(auVar244),auVar116,auVar116);
  auVar116 = vrcpps_avx(auVar124);
  auVar256 = vfnmadd213ps_fma(auVar124,auVar116,auVar223);
  auVar256 = vfmadd132ps_fma(ZEXT1632(auVar256),auVar116,auVar116);
  auVar124 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar101 * 7 + 6));
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar124 = vsubps_avx(auVar124,ZEXT1632(auVar144));
  auVar10._4_4_ = auVar112._4_4_ * auVar124._4_4_;
  auVar10._0_4_ = auVar112._0_4_ * auVar124._0_4_;
  auVar10._8_4_ = auVar112._8_4_ * auVar124._8_4_;
  auVar10._12_4_ = auVar112._12_4_ * auVar124._12_4_;
  auVar10._16_4_ = auVar124._16_4_ * 0.0;
  auVar10._20_4_ = auVar124._20_4_ * 0.0;
  auVar10._24_4_ = auVar124._24_4_ * 0.0;
  auVar10._28_4_ = auVar124._28_4_;
  auVar124 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar101 * 9 + 6));
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar124 = vsubps_avx(auVar124,ZEXT1632(auVar144));
  auVar11._4_4_ = auVar112._4_4_ * auVar124._4_4_;
  auVar11._0_4_ = auVar112._0_4_ * auVar124._0_4_;
  auVar11._8_4_ = auVar112._8_4_ * auVar124._8_4_;
  auVar11._12_4_ = auVar112._12_4_ * auVar124._12_4_;
  auVar11._16_4_ = auVar124._16_4_ * 0.0;
  auVar11._20_4_ = auVar124._20_4_ * 0.0;
  auVar11._24_4_ = auVar124._24_4_ * 0.0;
  auVar11._28_4_ = auVar124._28_4_;
  auVar147._1_3_ = 0;
  auVar147[0] = PVar6;
  auVar116 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar6 * 0x10 + 6));
  auVar124 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar6 * 0x10 + uVar101 * -2 + 6));
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar124 = vsubps_avx(auVar124,ZEXT1632(auVar3));
  auVar149._4_4_ = auVar124._4_4_ * auVar244._4_4_;
  auVar149._0_4_ = auVar124._0_4_ * auVar244._0_4_;
  auVar149._8_4_ = auVar124._8_4_ * auVar244._8_4_;
  auVar149._12_4_ = auVar124._12_4_ * auVar244._12_4_;
  auVar149._16_4_ = auVar124._16_4_ * 0.0;
  auVar149._20_4_ = auVar124._20_4_ * 0.0;
  auVar149._24_4_ = auVar124._24_4_ * 0.0;
  auVar149._28_4_ = auVar124._28_4_;
  auVar124 = vcvtdq2ps_avx(auVar116);
  auVar124 = vsubps_avx(auVar124,ZEXT1632(auVar3));
  auVar232._4_4_ = auVar244._4_4_ * auVar124._4_4_;
  auVar232._0_4_ = auVar244._0_4_ * auVar124._0_4_;
  auVar232._8_4_ = auVar244._8_4_ * auVar124._8_4_;
  auVar232._12_4_ = auVar244._12_4_ * auVar124._12_4_;
  auVar232._16_4_ = auVar124._16_4_ * 0.0;
  auVar232._20_4_ = auVar124._20_4_ * 0.0;
  auVar232._24_4_ = auVar124._24_4_ * 0.0;
  auVar232._28_4_ = auVar124._28_4_;
  auVar124 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar97 + uVar101 + 6));
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar124 = vsubps_avx(auVar124,ZEXT1632(auVar139));
  auVar12._4_4_ = auVar124._4_4_ * auVar256._4_4_;
  auVar12._0_4_ = auVar124._0_4_ * auVar256._0_4_;
  auVar12._8_4_ = auVar124._8_4_ * auVar256._8_4_;
  auVar12._12_4_ = auVar124._12_4_ * auVar256._12_4_;
  auVar12._16_4_ = auVar124._16_4_ * 0.0;
  auVar12._20_4_ = auVar124._20_4_ * 0.0;
  auVar12._24_4_ = auVar124._24_4_ * 0.0;
  auVar12._28_4_ = auVar124._28_4_;
  auVar124 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar101 * 0x17 + 6));
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar124 = vsubps_avx(auVar124,ZEXT1632(auVar139));
  auVar13._4_4_ = auVar256._4_4_ * auVar124._4_4_;
  auVar13._0_4_ = auVar256._0_4_ * auVar124._0_4_;
  auVar13._8_4_ = auVar256._8_4_ * auVar124._8_4_;
  auVar13._12_4_ = auVar256._12_4_ * auVar124._12_4_;
  auVar13._16_4_ = auVar124._16_4_ * 0.0;
  auVar13._20_4_ = auVar124._20_4_ * 0.0;
  auVar13._24_4_ = auVar124._24_4_ * 0.0;
  auVar13._28_4_ = auVar124._28_4_;
  auVar124 = vpminsd_avx2(auVar10,auVar11);
  auVar116 = vpminsd_avx2(auVar149,auVar232);
  auVar124 = vmaxps_avx(auVar124,auVar116);
  uVar100 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar231._4_4_ = uVar100;
  auVar231._0_4_ = uVar100;
  auVar231._8_4_ = uVar100;
  auVar231._12_4_ = uVar100;
  auVar231._16_4_ = uVar100;
  auVar231._20_4_ = uVar100;
  auVar231._24_4_ = uVar100;
  auVar231._28_4_ = uVar100;
  auVar116 = vpminsd_avx2(auVar12,auVar13);
  auVar116 = vmaxps_avx(auVar116,auVar231);
  auVar124 = vmaxps_avx(auVar124,auVar116);
  local_260._4_4_ = auVar124._4_4_ * 0.99999964;
  local_260._0_4_ = auVar124._0_4_ * 0.99999964;
  local_260._8_4_ = auVar124._8_4_ * 0.99999964;
  local_260._12_4_ = auVar124._12_4_ * 0.99999964;
  local_260._16_4_ = auVar124._16_4_ * 0.99999964;
  local_260._20_4_ = auVar124._20_4_ * 0.99999964;
  local_260._24_4_ = auVar124._24_4_ * 0.99999964;
  local_260._28_4_ = auVar116._28_4_;
  auVar124 = vpmaxsd_avx2(auVar10,auVar11);
  auVar116 = vpmaxsd_avx2(auVar149,auVar232);
  auVar124 = vminps_avx(auVar124,auVar116);
  auVar116 = vpmaxsd_avx2(auVar12,auVar13);
  fVar201 = (ray->super_RayK<1>).tfar;
  auVar171._4_4_ = fVar201;
  auVar171._0_4_ = fVar201;
  auVar171._8_4_ = fVar201;
  auVar171._12_4_ = fVar201;
  auVar171._16_4_ = fVar201;
  auVar171._20_4_ = fVar201;
  auVar171._24_4_ = fVar201;
  auVar171._28_4_ = fVar201;
  auVar116 = vminps_avx(auVar116,auVar171);
  auVar124 = vminps_avx(auVar124,auVar116);
  auVar267._4_4_ = auVar124._4_4_ * 1.0000004;
  auVar267._0_4_ = auVar124._0_4_ * 1.0000004;
  auVar267._8_4_ = auVar124._8_4_ * 1.0000004;
  auVar267._12_4_ = auVar124._12_4_ * 1.0000004;
  auVar267._16_4_ = auVar124._16_4_ * 1.0000004;
  auVar267._20_4_ = auVar124._20_4_ * 1.0000004;
  auVar267._24_4_ = auVar124._24_4_ * 1.0000004;
  auVar267._28_4_ = auVar124._28_4_;
  auVar147[4] = PVar6;
  auVar147._5_3_ = 0;
  auVar147[8] = PVar6;
  auVar147._9_3_ = 0;
  auVar147[0xc] = PVar6;
  auVar147._13_3_ = 0;
  auVar147[0x10] = PVar6;
  auVar147._17_3_ = 0;
  auVar147[0x14] = PVar6;
  auVar147._21_3_ = 0;
  auVar147[0x18] = PVar6;
  auVar147._25_3_ = 0;
  auVar147[0x1c] = PVar6;
  auVar147._29_3_ = 0;
  auVar116 = vpcmpgtd_avx2(auVar147,_DAT_0205a920);
  auVar124 = vcmpps_avx(local_260,auVar267,2);
  auVar124 = vandps_avx(auVar124,auVar116);
  uVar98 = vmovmskps_avx(auVar124);
  if (uVar98 == 0) {
    return;
  }
  uVar98 = uVar98 & 0xff;
  auVar124._16_16_ = mm_lookupmask_ps._240_16_;
  auVar124._0_16_ = mm_lookupmask_ps._240_16_;
  local_440 = vblendps_avx(auVar124,ZEXT832(0) << 0x20,0x80);
  local_7d0 = prim;
  local_7d8 = prim + lVar102 + 0x16;
  local_640 = 0x80000000;
  uStack_63c = 0x80000000;
  uStack_638 = 0x80000000;
  uStack_634 = 0x80000000;
  fStack_630 = -0.0;
  fStack_62c = -0.0;
  fStack_628 = -0.0;
  uStack_624 = 0x80000000;
LAB_0183b637:
  lVar102 = 0;
  local_7c8 = (ulong)uVar98;
  for (uVar101 = local_7c8; (uVar101 & 1) == 0; uVar101 = uVar101 >> 1 | 0x8000000000000000) {
    lVar102 = lVar102 + 1;
  }
  local_7c8 = local_7c8 - 1 & local_7c8;
  uVar98 = *(uint *)(local_7d0 + lVar102 * 4 + 6);
  uVar101 = (ulong)(uint)((int)lVar102 << 6);
  auVar112 = *(undefined1 (*) [16])(local_7d8 + uVar101);
  if (local_7c8 != 0) {
    uVar99 = local_7c8 - 1 & local_7c8;
    for (uVar97 = local_7c8; (uVar97 & 1) == 0; uVar97 = uVar97 >> 1 | 0x8000000000000000) {
    }
    if (uVar99 != 0) {
      for (; (uVar99 & 1) == 0; uVar99 = uVar99 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar244 = *(undefined1 (*) [16])(local_7d8 + uVar101 + 0x10);
  auVar256 = *(undefined1 (*) [16])(local_7d8 + uVar101 + 0x20);
  auVar139 = *(undefined1 (*) [16])(local_7d8 + uVar101 + 0x30);
  auVar217._0_4_ = (auVar112._0_4_ + auVar244._0_4_ + auVar256._0_4_ + auVar139._0_4_) * 0.25;
  auVar217._4_4_ = (auVar112._4_4_ + auVar244._4_4_ + auVar256._4_4_ + auVar139._4_4_) * 0.25;
  auVar217._8_4_ = (auVar112._8_4_ + auVar244._8_4_ + auVar256._8_4_ + auVar139._8_4_) * 0.25;
  auVar217._12_4_ = (auVar112._12_4_ + auVar244._12_4_ + auVar256._12_4_ + auVar139._12_4_) * 0.25;
  aVar1 = (ray->super_RayK<1>).org.field_0;
  aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar3 = vsubps_avx(auVar217,(undefined1  [16])aVar1);
  auVar3 = vdpps_avx(auVar3,(undefined1  [16])aVar2,0x7f);
  auVar165 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
  local_b08 = (ulong)*(uint *)(local_7d0 + 2);
  auVar144 = vrcpss_avx(auVar165,auVar165);
  auVar165 = vfnmadd213ss_fma(auVar144,auVar165,ZEXT416(0x40000000));
  auVar248 = ZEXT1664(auVar165);
  fVar201 = auVar144._0_4_ * auVar165._0_4_;
  auVar234 = ZEXT464((uint)fVar201);
  fVar201 = auVar3._0_4_ * fVar201;
  local_7f0 = ZEXT416((uint)fVar201);
  auVar218._4_4_ = fVar201;
  auVar218._0_4_ = fVar201;
  auVar218._8_4_ = fVar201;
  auVar218._12_4_ = fVar201;
  fStack_750 = fVar201;
  _local_760 = auVar218;
  fStack_74c = fVar201;
  fStack_748 = fVar201;
  fStack_744 = fVar201;
  auVar3 = vfmadd231ps_fma((undefined1  [16])aVar1,(undefined1  [16])aVar2,auVar218);
  auVar3 = vblendps_avx(auVar3,_DAT_01feba10,8);
  local_a10 = vsubps_avx(auVar112,auVar3);
  local_a20 = vsubps_avx(auVar256,auVar3);
  local_a30 = vsubps_avx(auVar244,auVar3);
  _local_a40 = vsubps_avx(auVar139,auVar3);
  auVar112 = vmovshdup_avx(local_a10);
  local_1a0 = auVar112._0_8_;
  uStack_198 = local_1a0;
  uStack_190 = local_1a0;
  uStack_188 = local_1a0;
  auVar112 = vshufps_avx(local_a10,local_a10,0xaa);
  local_1c0 = auVar112._0_8_;
  uStack_1b8 = local_1c0;
  uStack_1b0 = local_1c0;
  uStack_1a8 = local_1c0;
  auVar112 = vshufps_avx(local_a10,local_a10,0xff);
  local_2e0 = auVar112._0_8_;
  uStack_2d8 = local_2e0;
  uStack_2d0 = local_2e0;
  uStack_2c8 = local_2e0;
  auVar112 = vmovshdup_avx(local_a30);
  local_300 = auVar112._0_8_;
  uStack_2f8 = local_300;
  uStack_2f0 = local_300;
  uStack_2e8 = local_300;
  auVar112 = vshufps_avx(local_a30,local_a30,0xaa);
  local_320 = auVar112._0_8_;
  uStack_318 = local_320;
  uStack_310 = local_320;
  uStack_308 = local_320;
  auVar112 = vshufps_avx(local_a30,local_a30,0xff);
  local_1e0 = auVar112._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar112 = vmovshdup_avx(local_a20);
  local_200 = auVar112._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar112 = vshufps_avx(local_a20,local_a20,0xaa);
  local_220 = auVar112._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar112 = vshufps_avx(local_a20,local_a20,0xff);
  local_340 = auVar112._0_8_;
  uStack_338 = local_340;
  uStack_330 = local_340;
  uStack_328 = local_340;
  auVar112 = vmovshdup_avx(_local_a40);
  local_360 = auVar112._0_8_;
  uStack_358 = local_360;
  uStack_350 = local_360;
  uStack_348 = local_360;
  auVar112 = vshufps_avx(_local_a40,_local_a40,0xaa);
  local_380 = auVar112._0_8_;
  uStack_378 = local_380;
  uStack_370 = local_380;
  uStack_368 = local_380;
  auVar112 = vshufps_avx(_local_a40,_local_a40,0xff);
  local_3a0 = auVar112._0_8_;
  uStack_398 = local_3a0;
  uStack_390 = local_3a0;
  uStack_388 = local_3a0;
  auVar106._0_4_ = aVar2.x * aVar2.x;
  auVar106._4_4_ = aVar2.y * aVar2.y;
  auVar106._8_4_ = aVar2.z * aVar2.z;
  auVar106._12_4_ = aVar2.field_3.w * aVar2.field_3.w;
  auVar112 = vshufps_avx(auVar106,auVar106,0xaa);
  auVar116._0_8_ = auVar112._0_8_;
  auVar116._8_8_ = auVar116._0_8_;
  auVar116._16_8_ = auVar116._0_8_;
  auVar116._24_8_ = auVar116._0_8_;
  uVar100 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
  local_540._4_4_ = uVar100;
  local_540._0_4_ = uVar100;
  fStack_538 = (float)uVar100;
  fStack_534 = (float)uVar100;
  fStack_530 = (float)uVar100;
  fStack_52c = (float)uVar100;
  fStack_528 = (float)uVar100;
  register0x0000125c = uVar100;
  uVar100 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
  local_560._4_4_ = uVar100;
  local_560._0_4_ = uVar100;
  fStack_558 = (float)uVar100;
  fStack_554 = (float)uVar100;
  fStack_550 = (float)uVar100;
  fStack_54c = (float)uVar100;
  fStack_548 = (float)uVar100;
  register0x0000135c = uVar100;
  auVar225 = ZEXT3264(_local_560);
  auVar112 = vfmadd231ps_fma(auVar116,_local_560,_local_560);
  auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),_local_540,_local_540);
  uVar101 = 1;
  uVar97 = 0;
  local_580 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fStack_57c = local_580;
  fStack_578 = local_580;
  fStack_574 = local_580;
  fStack_570 = local_580;
  fStack_56c = local_580;
  fStack_568 = local_580;
  fStack_564 = local_580;
  local_3c0 = local_a10._0_4_;
  uStack_3bc = local_3c0;
  uStack_3b8 = local_3c0;
  uStack_3b4 = local_3c0;
  uStack_3b0 = local_3c0;
  uStack_3ac = local_3c0;
  uStack_3a8 = local_3c0;
  uStack_3a4 = local_3c0;
  local_3e0 = local_a30._0_4_;
  uStack_3dc = local_3e0;
  uStack_3d8 = local_3e0;
  uStack_3d4 = local_3e0;
  uStack_3d0 = local_3e0;
  uStack_3cc = local_3e0;
  uStack_3c8 = local_3e0;
  uStack_3c4 = local_3e0;
  local_400 = local_a20._0_4_;
  uStack_3fc = local_400;
  uStack_3f8 = local_400;
  uStack_3f4 = local_400;
  uStack_3f0 = local_400;
  uStack_3ec = local_400;
  uStack_3e8 = local_400;
  uStack_3e4 = local_400;
  local_420 = local_a40._0_4_;
  fStack_41c = local_420;
  fStack_418 = local_420;
  fStack_414 = local_420;
  fStack_410 = local_420;
  fStack_40c = local_420;
  fStack_408 = local_420;
  fStack_404 = local_420;
  local_240 = ZEXT1632(auVar112);
  local_460 = vandps_avx(ZEXT1632(auVar112),local_7c0);
  local_800 = 0x3f80000000000000;
  uStack_7f8 = 0;
  do {
    auVar208._8_4_ = 0x3f800000;
    auVar208._0_8_ = &DAT_3f8000003f800000;
    auVar208._12_4_ = 0x3f800000;
    auVar208._16_4_ = 0x3f800000;
    auVar208._20_4_ = 0x3f800000;
    auVar208._24_4_ = 0x3f800000;
    auVar208._28_4_ = 0x3f800000;
    auVar73._8_8_ = uStack_7f8;
    auVar73._0_8_ = local_800;
    auVar112 = vmovshdup_avx(auVar73);
    fVar201 = (float)local_800;
    fVar278 = auVar112._0_4_ - fVar201;
    fVar277 = fVar278 * 0.04761905;
    local_940._4_4_ = fVar201;
    local_940._0_4_ = fVar201;
    local_940._8_4_ = fVar201;
    local_940._12_4_ = fVar201;
    local_940._16_4_ = fVar201;
    local_940._20_4_ = fVar201;
    local_940._24_4_ = fVar201;
    local_940._28_4_ = fVar201;
    local_860._4_4_ = fVar278;
    local_860._0_4_ = fVar278;
    local_860._8_4_ = fVar278;
    local_860._12_4_ = fVar278;
    local_860._16_4_ = fVar278;
    local_860._20_4_ = fVar278;
    local_860._24_4_ = fVar278;
    local_860._28_4_ = fVar278;
    auVar112 = vfmadd231ps_fma(local_940,local_860,_DAT_02020f20);
    auVar124 = vsubps_avx(auVar208,ZEXT1632(auVar112));
    fVar201 = auVar124._0_4_;
    fVar213 = auVar124._4_4_;
    fVar214 = auVar124._8_4_;
    fVar216 = auVar124._12_4_;
    fVar274 = auVar124._16_4_;
    fVar275 = auVar124._20_4_;
    fVar276 = auVar124._24_4_;
    fVar104 = fVar201 * fVar201 * fVar201;
    fVar131 = fVar213 * fVar213 * fVar213;
    fVar132 = fVar214 * fVar214 * fVar214;
    fVar133 = fVar216 * fVar216 * fVar216;
    fVar134 = fVar274 * fVar274 * fVar274;
    fVar135 = fVar275 * fVar275 * fVar275;
    fVar136 = fVar276 * fVar276 * fVar276;
    fVar212 = auVar112._0_4_;
    fVar215 = auVar112._4_4_;
    fVar235 = auVar112._8_4_;
    fVar265 = auVar112._12_4_;
    fVar161 = fVar212 * fVar212 * fVar212;
    fVar179 = fVar215 * fVar215 * fVar215;
    fVar180 = fVar235 * fVar235 * fVar235;
    fVar181 = fVar265 * fVar265 * fVar265;
    fVar243 = fVar201 * fVar212;
    fVar249 = fVar213 * fVar215;
    fVar250 = fVar214 * fVar235;
    fVar251 = fVar216 * fVar265;
    fVar252 = fVar274 * 0.0;
    fVar253 = fVar275 * 0.0;
    fVar254 = fVar276 * 0.0;
    fVar260 = auVar259._28_4_ + auVar273._28_4_ + fVar278;
    fVar279 = auVar264._28_4_;
    auVar16._4_4_ = fVar131 * 0.16666667;
    auVar16._0_4_ = fVar104 * 0.16666667;
    auVar16._8_4_ = fVar132 * 0.16666667;
    auVar16._12_4_ = fVar133 * 0.16666667;
    auVar16._16_4_ = fVar134 * 0.16666667;
    auVar16._20_4_ = fVar135 * 0.16666667;
    auVar16._24_4_ = fVar136 * 0.16666667;
    auVar16._28_4_ = fVar260;
    auVar17._4_4_ =
         (fVar213 * fVar249 * 12.0 + fVar249 * fVar215 * 6.0 + fVar179 + fVar131 * 4.0) * 0.16666667
    ;
    auVar17._0_4_ =
         (fVar201 * fVar243 * 12.0 + fVar243 * fVar212 * 6.0 + fVar161 + fVar104 * 4.0) * 0.16666667
    ;
    auVar17._8_4_ =
         (fVar214 * fVar250 * 12.0 + fVar250 * fVar235 * 6.0 + fVar180 + fVar132 * 4.0) * 0.16666667
    ;
    auVar17._12_4_ =
         (fVar216 * fVar251 * 12.0 + fVar251 * fVar265 * 6.0 + fVar181 + fVar133 * 4.0) * 0.16666667
    ;
    auVar17._16_4_ =
         (fVar274 * fVar252 * 12.0 + fVar252 * 0.0 * 6.0 + fVar134 * 4.0 + 0.0) * 0.16666667;
    auVar17._20_4_ =
         (fVar275 * fVar253 * 12.0 + fVar253 * 0.0 * 6.0 + fVar135 * 4.0 + 0.0) * 0.16666667;
    auVar17._24_4_ =
         (fVar276 * fVar254 * 12.0 + fVar254 * 0.0 * 6.0 + fVar136 * 4.0 + 0.0) * 0.16666667;
    auVar17._28_4_ = fVar279;
    auVar18._4_4_ =
         (fVar179 * 4.0 + fVar131 + fVar249 * fVar215 * 12.0 + fVar213 * fVar249 * 6.0) * 0.16666667
    ;
    auVar18._0_4_ =
         (fVar161 * 4.0 + fVar104 + fVar243 * fVar212 * 12.0 + fVar201 * fVar243 * 6.0) * 0.16666667
    ;
    auVar18._8_4_ =
         (fVar180 * 4.0 + fVar132 + fVar250 * fVar235 * 12.0 + fVar214 * fVar250 * 6.0) * 0.16666667
    ;
    auVar18._12_4_ =
         (fVar181 * 4.0 + fVar133 + fVar251 * fVar265 * 12.0 + fVar216 * fVar251 * 6.0) * 0.16666667
    ;
    auVar18._16_4_ = (fVar134 + 0.0 + fVar252 * 0.0 * 12.0 + fVar274 * fVar252 * 6.0) * 0.16666667;
    auVar18._20_4_ = (fVar135 + 0.0 + fVar253 * 0.0 * 12.0 + fVar275 * fVar253 * 6.0) * 0.16666667;
    auVar18._24_4_ = (fVar136 + 0.0 + fVar254 * 0.0 * 12.0 + fVar276 * fVar254 * 6.0) * 0.16666667;
    auVar18._28_4_ = auVar273._28_4_;
    fVar161 = fVar161 * 0.16666667;
    fVar179 = fVar179 * 0.16666667;
    fVar180 = fVar180 * 0.16666667;
    fVar181 = fVar181 * 0.16666667;
    auVar19._4_4_ = fVar179 * fStack_41c;
    auVar19._0_4_ = fVar161 * local_420;
    auVar19._8_4_ = fVar180 * fStack_418;
    auVar19._12_4_ = fVar181 * fStack_414;
    auVar19._16_4_ = fStack_410 * 0.0;
    auVar19._20_4_ = fStack_40c * 0.0;
    auVar19._24_4_ = fStack_408 * 0.0;
    auVar19._28_4_ = fVar278;
    auVar264._0_4_ = fVar161 * (float)local_360;
    auVar264._4_4_ = fVar179 * local_360._4_4_;
    auVar264._8_4_ = fVar180 * (float)uStack_358;
    auVar264._12_4_ = fVar181 * uStack_358._4_4_;
    auVar264._16_4_ = (float)uStack_350 * 0.0;
    auVar264._20_4_ = uStack_350._4_4_ * 0.0;
    auVar264._28_36_ = auVar294._28_36_;
    auVar264._24_4_ = (float)uStack_348 * 0.0;
    auVar20._4_4_ = fVar179 * local_380._4_4_;
    auVar20._0_4_ = fVar161 * (float)local_380;
    auVar20._8_4_ = fVar180 * (float)uStack_378;
    auVar20._12_4_ = fVar181 * uStack_378._4_4_;
    auVar20._16_4_ = (float)uStack_370 * 0.0;
    auVar20._20_4_ = uStack_370._4_4_ * 0.0;
    auVar20._24_4_ = (float)uStack_368 * 0.0;
    auVar20._28_4_ = 0x40c00000;
    auVar21._4_4_ = fVar179 * local_3a0._4_4_;
    auVar21._0_4_ = fVar161 * (float)local_3a0;
    auVar21._8_4_ = fVar180 * (float)uStack_398;
    auVar21._12_4_ = fVar181 * uStack_398._4_4_;
    auVar21._16_4_ = (float)uStack_390 * 0.0;
    auVar21._20_4_ = uStack_390._4_4_ * 0.0;
    auVar21._24_4_ = (float)uStack_388 * 0.0;
    auVar21._28_4_ = fVar260 + fVar279 + auVar225._28_4_;
    auVar76._4_4_ = uStack_3fc;
    auVar76._0_4_ = local_400;
    auVar76._8_4_ = uStack_3f8;
    auVar76._12_4_ = uStack_3f4;
    auVar76._16_4_ = uStack_3f0;
    auVar76._20_4_ = uStack_3ec;
    auVar76._24_4_ = uStack_3e8;
    auVar76._28_4_ = uStack_3e4;
    auVar112 = vfmadd231ps_fma(auVar19,auVar18,auVar76);
    auVar91._8_8_ = uStack_1f8;
    auVar91._0_8_ = local_200;
    auVar91._16_8_ = uStack_1f0;
    auVar91._24_8_ = uStack_1e8;
    auVar244 = vfmadd231ps_fma(auVar264._0_32_,auVar18,auVar91);
    auVar90._8_8_ = uStack_218;
    auVar90._0_8_ = local_220;
    auVar90._16_8_ = uStack_210;
    auVar90._24_8_ = uStack_208;
    auVar256 = vfmadd231ps_fma(auVar20,auVar18,auVar90);
    auVar82._8_8_ = uStack_338;
    auVar82._0_8_ = local_340;
    auVar82._16_8_ = uStack_330;
    auVar82._24_8_ = uStack_328;
    auVar139 = vfmadd231ps_fma(auVar21,auVar18,auVar82);
    auVar78._4_4_ = uStack_3dc;
    auVar78._0_4_ = local_3e0;
    auVar78._8_4_ = uStack_3d8;
    auVar78._12_4_ = uStack_3d4;
    auVar78._16_4_ = uStack_3d0;
    auVar78._20_4_ = uStack_3cc;
    auVar78._24_4_ = uStack_3c8;
    auVar78._28_4_ = uStack_3c4;
    auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar17,auVar78);
    auVar86._8_8_ = uStack_2f8;
    auVar86._0_8_ = local_300;
    auVar86._16_8_ = uStack_2f0;
    auVar86._24_8_ = uStack_2e8;
    auVar244 = vfmadd231ps_fma(ZEXT1632(auVar244),auVar17,auVar86);
    auVar84._8_8_ = uStack_318;
    auVar84._0_8_ = local_320;
    auVar84._16_8_ = uStack_310;
    auVar84._24_8_ = uStack_308;
    auVar256 = vfmadd231ps_fma(ZEXT1632(auVar256),auVar17,auVar84);
    auVar92._8_8_ = uStack_1d8;
    auVar92._0_8_ = local_1e0;
    auVar92._16_8_ = uStack_1d0;
    auVar92._24_8_ = uStack_1c8;
    auVar139 = vfmadd231ps_fma(ZEXT1632(auVar139),auVar92,auVar17);
    auVar80._4_4_ = uStack_3bc;
    auVar80._0_4_ = local_3c0;
    auVar80._8_4_ = uStack_3b8;
    auVar80._12_4_ = uStack_3b4;
    auVar80._16_4_ = uStack_3b0;
    auVar80._20_4_ = uStack_3ac;
    auVar80._24_4_ = uStack_3a8;
    auVar80._28_4_ = uStack_3a4;
    auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar16,auVar80);
    local_ae0 = ZEXT1632(auVar112);
    auVar94._8_8_ = uStack_198;
    auVar94._0_8_ = local_1a0;
    auVar94._16_8_ = uStack_190;
    auVar94._24_8_ = uStack_188;
    auVar244 = vfmadd231ps_fma(ZEXT1632(auVar244),auVar16,auVar94);
    auVar93._8_8_ = uStack_1b8;
    auVar93._0_8_ = local_1c0;
    auVar93._16_8_ = uStack_1b0;
    auVar93._24_8_ = uStack_1a8;
    auVar256 = vfmadd231ps_fma(ZEXT1632(auVar256),auVar16,auVar93);
    auVar88._8_8_ = uStack_2d8;
    auVar88._0_8_ = local_2e0;
    auVar88._16_8_ = uStack_2d0;
    auVar88._24_8_ = uStack_2c8;
    auVar139 = vfmadd231ps_fma(ZEXT1632(auVar139),auVar16,auVar88);
    auVar226._0_4_ = (float)((uint)fVar212 ^ local_640) * fVar212;
    auVar226._4_4_ = (float)((uint)fVar215 ^ uStack_63c) * fVar215;
    auVar226._8_4_ = (float)((uint)fVar235 ^ uStack_638) * fVar235;
    auVar226._12_4_ = (float)((uint)fVar265 ^ uStack_634) * fVar265;
    auVar226._16_4_ = fStack_630 * 0.0;
    auVar226._20_4_ = fStack_62c * 0.0;
    auVar226._24_4_ = fStack_628 * 0.0;
    auVar226._28_4_ = 0;
    auVar22._4_4_ = fVar249 * 4.0;
    auVar22._0_4_ = fVar243 * 4.0;
    auVar22._8_4_ = fVar250 * 4.0;
    auVar22._12_4_ = fVar251 * 4.0;
    auVar22._16_4_ = fVar252 * 4.0;
    auVar22._20_4_ = fVar253 * 4.0;
    fVar278 = auVar248._28_4_;
    auVar22._24_4_ = fVar254 * 4.0;
    auVar22._28_4_ = fVar278;
    auVar116 = vsubps_avx(auVar226,auVar22);
    fVar104 = fVar278 + auVar234._28_4_;
    auVar23._4_4_ = fVar213 * (float)((uint)fVar213 ^ uStack_63c) * 0.5;
    auVar23._0_4_ = fVar201 * (float)((uint)fVar201 ^ local_640) * 0.5;
    auVar23._8_4_ = fVar214 * (float)((uint)fVar214 ^ uStack_638) * 0.5;
    auVar23._12_4_ = fVar216 * (float)((uint)fVar216 ^ uStack_634) * 0.5;
    auVar23._16_4_ = fVar274 * (float)((uint)fVar274 ^ (uint)fStack_630) * 0.5;
    auVar23._20_4_ = fVar275 * (float)((uint)fVar275 ^ (uint)fStack_62c) * 0.5;
    auVar23._24_4_ = fVar276 * (float)((uint)fVar276 ^ (uint)fStack_628) * 0.5;
    auVar23._28_4_ = auVar124._28_4_;
    auVar24._4_4_ = auVar116._4_4_ * 0.5;
    auVar24._0_4_ = auVar116._0_4_ * 0.5;
    auVar24._8_4_ = auVar116._8_4_ * 0.5;
    auVar24._12_4_ = auVar116._12_4_ * 0.5;
    auVar24._16_4_ = auVar116._16_4_ * 0.5;
    auVar24._20_4_ = auVar116._20_4_ * 0.5;
    auVar24._24_4_ = auVar116._24_4_ * 0.5;
    auVar24._28_4_ = auVar116._28_4_;
    auVar25._4_4_ = (fVar249 * 4.0 + fVar213 * fVar213) * 0.5;
    auVar25._0_4_ = (fVar243 * 4.0 + fVar201 * fVar201) * 0.5;
    auVar25._8_4_ = (fVar250 * 4.0 + fVar214 * fVar214) * 0.5;
    auVar25._12_4_ = (fVar251 * 4.0 + fVar216 * fVar216) * 0.5;
    auVar25._16_4_ = (fVar252 * 4.0 + fVar274 * fVar274) * 0.5;
    auVar25._20_4_ = (fVar253 * 4.0 + fVar275 * fVar275) * 0.5;
    auVar25._24_4_ = (fVar254 * 4.0 + fVar276 * fVar276) * 0.5;
    auVar25._28_4_ = fVar104;
    fVar201 = fVar212 * fVar212 * 0.5;
    fVar212 = fVar215 * fVar215 * 0.5;
    fVar213 = fVar235 * fVar235 * 0.5;
    fVar215 = fVar265 * fVar265 * 0.5;
    auVar26._4_4_ = fVar212 * fStack_41c;
    auVar26._0_4_ = fVar201 * local_420;
    auVar26._8_4_ = fVar213 * fStack_418;
    auVar26._12_4_ = fVar215 * fStack_414;
    auVar26._16_4_ = fStack_410 * 0.0;
    auVar26._20_4_ = fStack_40c * 0.0;
    auVar26._24_4_ = fStack_408 * 0.0;
    auVar26._28_4_ = fVar278;
    auVar27._4_4_ = fVar212 * local_360._4_4_;
    auVar27._0_4_ = fVar201 * (float)local_360;
    auVar27._8_4_ = fVar213 * (float)uStack_358;
    auVar27._12_4_ = fVar215 * uStack_358._4_4_;
    auVar27._16_4_ = (float)uStack_350 * 0.0;
    auVar27._20_4_ = uStack_350._4_4_ * 0.0;
    auVar27._24_4_ = (float)uStack_348 * 0.0;
    auVar27._28_4_ = uStack_624;
    auVar28._4_4_ = fVar212 * local_380._4_4_;
    auVar28._0_4_ = fVar201 * (float)local_380;
    auVar28._8_4_ = fVar213 * (float)uStack_378;
    auVar28._12_4_ = fVar215 * uStack_378._4_4_;
    auVar28._16_4_ = (float)uStack_370 * 0.0;
    auVar28._20_4_ = uStack_370._4_4_ * 0.0;
    auVar28._24_4_ = (float)uStack_368 * 0.0;
    auVar28._28_4_ = fVar279;
    auVar29._4_4_ = fVar212 * local_3a0._4_4_;
    auVar29._0_4_ = fVar201 * (float)local_3a0;
    auVar29._8_4_ = fVar213 * (float)uStack_398;
    auVar29._12_4_ = fVar215 * uStack_398._4_4_;
    auVar29._16_4_ = (float)uStack_390 * 0.0;
    auVar29._20_4_ = uStack_390._4_4_ * 0.0;
    auVar29._24_4_ = (float)uStack_388 * 0.0;
    auVar29._28_4_ = 0x3f800000;
    auVar77._4_4_ = uStack_3fc;
    auVar77._0_4_ = local_400;
    auVar77._8_4_ = uStack_3f8;
    auVar77._12_4_ = uStack_3f4;
    auVar77._16_4_ = uStack_3f0;
    auVar77._20_4_ = uStack_3ec;
    auVar77._24_4_ = uStack_3e8;
    auVar77._28_4_ = uStack_3e4;
    auVar112 = vfmadd231ps_fma(auVar26,auVar25,auVar77);
    auVar3 = vfmadd231ps_fma(auVar27,auVar25,auVar91);
    auVar165 = vfmadd231ps_fma(auVar28,auVar25,auVar90);
    auVar83._8_8_ = uStack_338;
    auVar83._0_8_ = local_340;
    auVar83._16_8_ = uStack_330;
    auVar83._24_8_ = uStack_328;
    auVar144 = vfmadd231ps_fma(auVar29,auVar25,auVar83);
    auVar79._4_4_ = uStack_3dc;
    auVar79._0_4_ = local_3e0;
    auVar79._8_4_ = uStack_3d8;
    auVar79._12_4_ = uStack_3d4;
    auVar79._16_4_ = uStack_3d0;
    auVar79._20_4_ = uStack_3cc;
    auVar79._24_4_ = uStack_3c8;
    auVar79._28_4_ = uStack_3c4;
    auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar24,auVar79);
    auVar87._8_8_ = uStack_2f8;
    auVar87._0_8_ = local_300;
    auVar87._16_8_ = uStack_2f0;
    auVar87._24_8_ = uStack_2e8;
    auVar3 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar24,auVar87);
    auVar85._8_8_ = uStack_318;
    auVar85._0_8_ = local_320;
    auVar85._16_8_ = uStack_310;
    auVar85._24_8_ = uStack_308;
    auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),auVar24,auVar85);
    auVar144 = vfmadd231ps_fma(ZEXT1632(auVar144),auVar92,auVar24);
    auVar81._4_4_ = uStack_3bc;
    auVar81._0_4_ = local_3c0;
    auVar81._8_4_ = uStack_3b8;
    auVar81._12_4_ = uStack_3b4;
    auVar81._16_4_ = uStack_3b0;
    auVar81._20_4_ = uStack_3ac;
    auVar81._24_4_ = uStack_3a8;
    auVar81._28_4_ = uStack_3a4;
    auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar23,auVar81);
    auVar3 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar23,auVar94);
    auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),auVar23,auVar93);
    auVar89._8_8_ = uStack_2d8;
    auVar89._0_8_ = local_2e0;
    auVar89._16_8_ = uStack_2d0;
    auVar89._24_8_ = uStack_2c8;
    auVar144 = vfmadd231ps_fma(ZEXT1632(auVar144),auVar23,auVar89);
    local_a60._0_4_ = auVar112._0_4_ * fVar277;
    local_a60._4_4_ = auVar112._4_4_ * fVar277;
    local_a60._8_4_ = auVar112._8_4_ * fVar277;
    local_a60._12_4_ = auVar112._12_4_ * fVar277;
    local_a60._16_4_ = fVar277 * 0.0;
    local_a60._20_4_ = fVar277 * 0.0;
    local_a60._24_4_ = fVar277 * 0.0;
    local_a60._28_4_ = 0;
    local_6c0._0_4_ = auVar3._0_4_ * fVar277;
    local_6c0._4_4_ = auVar3._4_4_ * fVar277;
    local_6c0._8_4_ = auVar3._8_4_ * fVar277;
    local_6c0._12_4_ = auVar3._12_4_ * fVar277;
    local_6c0._16_4_ = fVar277 * 0.0;
    local_6c0._20_4_ = fVar277 * 0.0;
    local_6c0._24_4_ = fVar277 * 0.0;
    local_6c0._28_4_ = 0;
    local_9e0._0_4_ = auVar165._0_4_ * fVar277;
    local_9e0._4_4_ = auVar165._4_4_ * fVar277;
    local_9e0._8_4_ = auVar165._8_4_ * fVar277;
    local_9e0._12_4_ = auVar165._12_4_ * fVar277;
    local_9e0._16_4_ = fVar277 * 0.0;
    local_9e0._20_4_ = fVar277 * 0.0;
    local_9e0._24_4_ = fVar277 * 0.0;
    local_9e0._28_4_ = 0;
    auVar209._0_4_ = fVar277 * auVar144._0_4_;
    auVar209._4_4_ = fVar277 * auVar144._4_4_;
    auVar209._8_4_ = fVar277 * auVar144._8_4_;
    auVar209._12_4_ = fVar277 * auVar144._12_4_;
    auVar209._16_4_ = fVar277 * 0.0;
    auVar209._20_4_ = fVar277 * 0.0;
    auVar209._24_4_ = fVar277 * 0.0;
    auVar209._28_4_ = 0;
    _local_960 = vpermps_avx2(_DAT_0205d4a0,local_ae0);
    local_900 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar244));
    local_820 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar256));
    local_680 = vsubps_avx(_local_960,local_ae0);
    _local_7a0 = vsubps_avx(local_820,ZEXT1632(auVar256));
    fVar201 = local_7a0._0_4_;
    fVar213 = local_7a0._4_4_;
    auVar30._4_4_ = local_a60._4_4_ * fVar213;
    auVar30._0_4_ = local_a60._0_4_ * fVar201;
    fVar214 = local_7a0._8_4_;
    auVar30._8_4_ = local_a60._8_4_ * fVar214;
    fVar216 = local_7a0._12_4_;
    auVar30._12_4_ = local_a60._12_4_ * fVar216;
    fVar274 = local_7a0._16_4_;
    auVar30._16_4_ = local_a60._16_4_ * fVar274;
    fVar276 = local_7a0._20_4_;
    auVar30._20_4_ = local_a60._20_4_ * fVar276;
    fVar278 = local_7a0._24_4_;
    auVar30._24_4_ = local_a60._24_4_ * fVar278;
    auVar30._28_4_ = local_820._28_4_;
    auVar112 = vfmsub231ps_fma(auVar30,local_9e0,local_680);
    local_6a0 = vsubps_avx(local_900,ZEXT1632(auVar244));
    fVar252 = local_680._0_4_;
    fVar253 = local_680._4_4_;
    auVar31._4_4_ = fVar253 * local_6c0._4_4_;
    auVar31._0_4_ = fVar252 * local_6c0._0_4_;
    fVar254 = local_680._8_4_;
    auVar31._8_4_ = fVar254 * local_6c0._8_4_;
    fVar260 = local_680._12_4_;
    auVar31._12_4_ = fVar260 * local_6c0._12_4_;
    fVar285 = local_680._16_4_;
    auVar31._16_4_ = fVar285 * local_6c0._16_4_;
    fVar286 = local_680._20_4_;
    auVar31._20_4_ = fVar286 * local_6c0._20_4_;
    fVar287 = local_680._24_4_;
    auVar31._24_4_ = fVar287 * local_6c0._24_4_;
    auVar31._28_4_ = local_900._28_4_;
    auVar3 = vfmsub231ps_fma(auVar31,local_a60,local_6a0);
    auVar112 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar3._12_4_ * auVar3._12_4_,
                                                  CONCAT48(auVar3._8_4_ * auVar3._8_4_,
                                                           CONCAT44(auVar3._4_4_ * auVar3._4_4_,
                                                                    auVar3._0_4_ * auVar3._0_4_)))),
                               ZEXT1632(auVar112),ZEXT1632(auVar112));
    fVar212 = local_6a0._0_4_;
    fVar215 = local_6a0._4_4_;
    auVar32._4_4_ = local_9e0._4_4_ * fVar215;
    auVar32._0_4_ = (float)local_9e0._0_4_ * fVar212;
    fVar235 = local_6a0._8_4_;
    auVar32._8_4_ = local_9e0._8_4_ * fVar235;
    fVar265 = local_6a0._12_4_;
    auVar32._12_4_ = local_9e0._12_4_ * fVar265;
    fVar275 = local_6a0._16_4_;
    auVar32._16_4_ = local_9e0._16_4_ * fVar275;
    fVar277 = local_6a0._20_4_;
    auVar32._20_4_ = local_9e0._20_4_ * fVar277;
    fVar279 = local_6a0._24_4_;
    auVar32._24_4_ = local_9e0._24_4_ * fVar279;
    auVar32._28_4_ = fVar104;
    auVar165 = vfmsub231ps_fma(auVar32,local_6c0,_local_7a0);
    auVar196._0_4_ = fVar201 * fVar201;
    auVar196._4_4_ = fVar213 * fVar213;
    auVar196._8_4_ = fVar214 * fVar214;
    auVar196._12_4_ = fVar216 * fVar216;
    auVar196._16_4_ = fVar274 * fVar274;
    auVar196._20_4_ = fVar276 * fVar276;
    auVar196._24_4_ = fVar278 * fVar278;
    auVar196._28_4_ = 0;
    auVar3 = vfmadd231ps_fma(auVar196,local_6a0,local_6a0);
    auVar3 = vfmadd231ps_fma(ZEXT1632(auVar3),local_680,local_680);
    auVar124 = vrcpps_avx(ZEXT1632(auVar3));
    auVar165 = vfmadd231ps_fma(ZEXT1632(auVar112),ZEXT1632(auVar165),ZEXT1632(auVar165));
    auVar266._8_4_ = 0x3f800000;
    auVar266._0_8_ = &DAT_3f8000003f800000;
    auVar266._12_4_ = 0x3f800000;
    auVar266._16_4_ = 0x3f800000;
    auVar266._20_4_ = 0x3f800000;
    auVar266._24_4_ = 0x3f800000;
    auVar266._28_4_ = 0x3f800000;
    auVar112 = vfnmadd213ps_fma(auVar124,ZEXT1632(auVar3),auVar266);
    auVar112 = vfmadd132ps_fma(ZEXT1632(auVar112),auVar124,auVar124);
    local_920 = vpermps_avx2(_DAT_0205d4a0,local_a60);
    local_840 = vpermps_avx2(_DAT_0205d4a0,local_9e0);
    auVar33._4_4_ = local_920._4_4_ * fVar213;
    auVar33._0_4_ = local_920._0_4_ * fVar201;
    auVar33._8_4_ = local_920._8_4_ * fVar214;
    auVar33._12_4_ = local_920._12_4_ * fVar216;
    auVar33._16_4_ = local_920._16_4_ * fVar274;
    auVar33._20_4_ = local_920._20_4_ * fVar276;
    auVar33._24_4_ = local_920._24_4_ * fVar278;
    auVar33._28_4_ = auVar124._28_4_;
    auVar144 = vfmsub231ps_fma(auVar33,local_840,local_680);
    local_a00 = vpermps_avx2(_DAT_0205d4a0,local_6c0);
    auVar34._4_4_ = fVar253 * local_a00._4_4_;
    auVar34._0_4_ = fVar252 * local_a00._0_4_;
    auVar34._8_4_ = fVar254 * local_a00._8_4_;
    auVar34._12_4_ = fVar260 * local_a00._12_4_;
    auVar34._16_4_ = fVar285 * local_a00._16_4_;
    auVar34._20_4_ = fVar286 * local_a00._20_4_;
    auVar34._24_4_ = fVar287 * local_a00._24_4_;
    auVar34._28_4_ = 0;
    auVar4 = vfmsub231ps_fma(auVar34,local_920,local_6a0);
    auVar144 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar4._12_4_ * auVar4._12_4_,
                                                  CONCAT48(auVar4._8_4_ * auVar4._8_4_,
                                                           CONCAT44(auVar4._4_4_ * auVar4._4_4_,
                                                                    auVar4._0_4_ * auVar4._0_4_)))),
                               ZEXT1632(auVar144),ZEXT1632(auVar144));
    auVar12 = local_840;
    fVar179 = local_840._0_4_;
    auVar237._0_4_ = fVar179 * fVar212;
    fVar180 = local_840._4_4_;
    auVar237._4_4_ = fVar180 * fVar215;
    fVar181 = local_840._8_4_;
    auVar237._8_4_ = fVar181 * fVar235;
    fVar243 = local_840._12_4_;
    auVar237._12_4_ = fVar243 * fVar265;
    fVar249 = local_840._16_4_;
    auVar237._16_4_ = fVar249 * fVar275;
    fVar250 = local_840._20_4_;
    auVar237._20_4_ = fVar250 * fVar277;
    fVar251 = local_840._24_4_;
    auVar237._24_4_ = fVar251 * fVar279;
    auVar237._28_4_ = 0;
    auVar4 = vfmsub231ps_fma(auVar237,local_a00,_local_7a0);
    auVar144 = vfmadd231ps_fma(ZEXT1632(auVar144),ZEXT1632(auVar4),ZEXT1632(auVar4));
    auVar124 = vmaxps_avx(ZEXT1632(CONCAT412(auVar165._12_4_ * auVar112._12_4_,
                                             CONCAT48(auVar165._8_4_ * auVar112._8_4_,
                                                      CONCAT44(auVar165._4_4_ * auVar112._4_4_,
                                                               auVar165._0_4_ * auVar112._0_4_)))),
                          ZEXT1632(CONCAT412(auVar144._12_4_ * auVar112._12_4_,
                                             CONCAT48(auVar144._8_4_ * auVar112._8_4_,
                                                      CONCAT44(auVar144._4_4_ * auVar112._4_4_,
                                                               auVar144._0_4_ * auVar112._0_4_)))));
    local_8a0._0_4_ = auVar209._0_4_ + auVar139._0_4_;
    local_8a0._4_4_ = auVar209._4_4_ + auVar139._4_4_;
    local_8a0._8_4_ = auVar209._8_4_ + auVar139._8_4_;
    local_8a0._12_4_ = auVar209._12_4_ + auVar139._12_4_;
    local_8a0._16_4_ = auVar209._16_4_ + 0.0;
    local_8a0._20_4_ = auVar209._20_4_ + 0.0;
    local_8a0._24_4_ = auVar209._24_4_ + 0.0;
    local_8a0._28_4_ = 0;
    auVar116 = vsubps_avx(ZEXT1632(auVar139),auVar209);
    _local_8c0 = vpermps_avx2(_DAT_0205d4a0,auVar116);
    local_980 = ZEXT1632(auVar139);
    local_6e0 = vpermps_avx2(_DAT_0205d4a0,local_980);
    auVar116 = vmaxps_avx(local_980,local_8a0);
    auVar9 = vmaxps_avx(_local_8c0,local_6e0);
    auVar10 = vrsqrtps_avx(ZEXT1632(auVar3));
    auVar116 = vmaxps_avx(auVar116,auVar9);
    fVar104 = auVar10._0_4_;
    fVar131 = auVar10._4_4_;
    fVar132 = auVar10._8_4_;
    fVar133 = auVar10._12_4_;
    fVar134 = auVar10._16_4_;
    fVar135 = auVar10._20_4_;
    fVar136 = auVar10._24_4_;
    auVar35._4_4_ = fVar131 * fVar131 * fVar131 * auVar3._4_4_ * -0.5;
    auVar35._0_4_ = fVar104 * fVar104 * fVar104 * auVar3._0_4_ * -0.5;
    auVar35._8_4_ = fVar132 * fVar132 * fVar132 * auVar3._8_4_ * -0.5;
    auVar35._12_4_ = fVar133 * fVar133 * fVar133 * auVar3._12_4_ * -0.5;
    auVar35._16_4_ = fVar134 * fVar134 * fVar134 * -0.0;
    auVar35._20_4_ = fVar135 * fVar135 * fVar135 * -0.0;
    auVar35._24_4_ = fVar136 * fVar136 * fVar136 * -0.0;
    auVar35._28_4_ = local_a00._28_4_;
    auVar117._8_4_ = 0x3fc00000;
    auVar117._0_8_ = 0x3fc000003fc00000;
    auVar117._12_4_ = 0x3fc00000;
    auVar117._16_4_ = 0x3fc00000;
    auVar117._20_4_ = 0x3fc00000;
    auVar117._24_4_ = 0x3fc00000;
    auVar117._28_4_ = 0x3fc00000;
    auVar112 = vfmadd231ps_fma(auVar35,auVar117,auVar10);
    auVar259 = ZEXT1664(auVar112);
    local_ac0 = ZEXT1632(auVar112);
    fVar134 = auVar112._0_4_;
    fVar135 = auVar112._4_4_;
    auVar36._4_4_ = fVar135 * fVar215;
    auVar36._0_4_ = fVar134 * fVar212;
    fVar136 = auVar112._8_4_;
    auVar36._8_4_ = fVar136 * fVar235;
    fVar161 = auVar112._12_4_;
    auVar36._12_4_ = fVar161 * fVar265;
    auVar36._16_4_ = fVar275 * 0.0;
    auVar36._20_4_ = fVar277 * 0.0;
    auVar36._24_4_ = fVar279 * 0.0;
    auVar36._28_4_ = 0;
    auVar37._4_4_ = fVar135 * fVar213 * fStack_57c;
    auVar37._0_4_ = fVar134 * fVar201 * local_580;
    auVar37._8_4_ = fVar136 * fVar214 * fStack_578;
    auVar37._12_4_ = fVar161 * fVar216 * fStack_574;
    auVar37._16_4_ = fVar274 * 0.0 * fStack_570;
    auVar37._20_4_ = fVar276 * 0.0 * fStack_56c;
    auVar37._24_4_ = fVar278 * 0.0 * fStack_568;
    auVar37._28_4_ = local_7a0._28_4_;
    auVar112 = vfmadd231ps_fma(auVar37,auVar36,_local_560);
    auVar273 = ZEXT864(0) << 0x20;
    local_780 = ZEXT1632(auVar256);
    auVar9 = vsubps_avx(ZEXT832(0) << 0x20,local_780);
    fVar212 = auVar9._0_4_;
    fVar215 = auVar9._4_4_;
    auVar38._4_4_ = fVar135 * fVar213 * fVar215;
    auVar38._0_4_ = fVar134 * fVar201 * fVar212;
    fVar235 = auVar9._8_4_;
    auVar38._8_4_ = fVar136 * fVar214 * fVar235;
    fVar265 = auVar9._12_4_;
    auVar38._12_4_ = fVar161 * fVar216 * fVar265;
    fVar275 = auVar9._16_4_;
    auVar38._16_4_ = fVar274 * 0.0 * fVar275;
    fVar274 = auVar9._20_4_;
    auVar38._20_4_ = fVar276 * 0.0 * fVar274;
    fVar276 = auVar9._24_4_;
    auVar38._24_4_ = fVar278 * 0.0 * fVar276;
    auVar38._28_4_ = 0x3fc00000;
    local_660 = ZEXT1632(auVar244);
    auVar11 = vsubps_avx(ZEXT832(0) << 0x20,local_660);
    auVar264 = ZEXT3264(auVar11);
    auVar256 = vfmadd231ps_fma(auVar38,auVar11,auVar36);
    auVar39._4_4_ = fVar253 * fVar135;
    auVar39._0_4_ = fVar252 * fVar134;
    auVar39._8_4_ = fVar254 * fVar136;
    auVar39._12_4_ = fVar260 * fVar161;
    auVar39._16_4_ = fVar285 * 0.0;
    auVar39._20_4_ = fVar286 * 0.0;
    auVar39._24_4_ = fVar287 * 0.0;
    auVar39._28_4_ = 0;
    auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar39,_local_540);
    auVar267 = ZEXT832(0) << 0x20;
    auVar149 = vsubps_avx(auVar267,local_ae0);
    auVar294 = ZEXT3264(auVar149);
    auVar256 = vfmadd231ps_fma(ZEXT1632(auVar256),auVar149,auVar39);
    auVar225 = ZEXT1664(auVar256);
    auVar40._4_4_ = fStack_57c * fVar215;
    auVar40._0_4_ = local_580 * fVar212;
    auVar40._8_4_ = fStack_578 * fVar235;
    auVar40._12_4_ = fStack_574 * fVar265;
    auVar40._16_4_ = fStack_570 * fVar275;
    auVar40._20_4_ = fStack_56c * fVar274;
    auVar40._24_4_ = fStack_568 * fVar276;
    auVar40._28_4_ = 0;
    auVar139 = vfmadd231ps_fma(auVar40,_local_560,auVar11);
    auVar139 = vfmadd231ps_fma(ZEXT1632(auVar139),_local_540,auVar149);
    fVar201 = auVar256._0_4_;
    fVar277 = auVar112._0_4_;
    fVar213 = auVar256._4_4_;
    fVar278 = auVar112._4_4_;
    fVar214 = auVar256._8_4_;
    fVar279 = auVar112._8_4_;
    fVar216 = auVar256._12_4_;
    fVar104 = auVar112._12_4_;
    auVar41._28_4_ = auVar10._28_4_;
    auVar41._0_28_ =
         ZEXT1628(CONCAT412(fVar104 * fVar216,
                            CONCAT48(fVar279 * fVar214,CONCAT44(fVar278 * fVar213,fVar277 * fVar201)
                                    )));
    auVar232 = vsubps_avx(ZEXT1632(auVar139),auVar41);
    auVar42._4_4_ = fVar215 * fVar215;
    auVar42._0_4_ = fVar212 * fVar212;
    auVar42._8_4_ = fVar235 * fVar235;
    auVar42._12_4_ = fVar265 * fVar265;
    auVar42._16_4_ = fVar275 * fVar275;
    auVar42._20_4_ = fVar274 * fVar274;
    auVar42._24_4_ = fVar276 * fVar276;
    auVar42._28_4_ = auVar10._28_4_;
    auVar139 = vfmadd231ps_fma(auVar42,auVar11,auVar11);
    auVar139 = vfmadd231ps_fma(ZEXT1632(auVar139),auVar149,auVar149);
    auVar43._28_4_ = local_680._28_4_;
    auVar43._0_28_ =
         ZEXT1628(CONCAT412(fVar216 * fVar216,
                            CONCAT48(fVar214 * fVar214,CONCAT44(fVar213 * fVar213,fVar201 * fVar201)
                                    )));
    auVar10 = vsubps_avx(ZEXT1632(auVar139),auVar43);
    local_720 = vsqrtps_avx(auVar124);
    fVar201 = (local_720._0_4_ + auVar116._0_4_) * 1.0000002;
    fVar213 = (local_720._4_4_ + auVar116._4_4_) * 1.0000002;
    fVar214 = (local_720._8_4_ + auVar116._8_4_) * 1.0000002;
    fVar216 = (local_720._12_4_ + auVar116._12_4_) * 1.0000002;
    fVar131 = (local_720._16_4_ + auVar116._16_4_) * 1.0000002;
    fVar132 = (local_720._20_4_ + auVar116._20_4_) * 1.0000002;
    fVar133 = (local_720._24_4_ + auVar116._24_4_) * 1.0000002;
    auVar44._4_4_ = fVar213 * fVar213;
    auVar44._0_4_ = fVar201 * fVar201;
    auVar44._8_4_ = fVar214 * fVar214;
    auVar44._12_4_ = fVar216 * fVar216;
    auVar44._16_4_ = fVar131 * fVar131;
    auVar44._20_4_ = fVar132 * fVar132;
    auVar44._24_4_ = fVar133 * fVar133;
    auVar44._28_4_ = local_720._28_4_ + auVar116._28_4_;
    local_5e0._0_4_ = auVar232._0_4_ + auVar232._0_4_;
    local_5e0._4_4_ = auVar232._4_4_ + auVar232._4_4_;
    fStack_5d8 = auVar232._8_4_ + auVar232._8_4_;
    fStack_5d4 = auVar232._12_4_ + auVar232._12_4_;
    fStack_5d0 = auVar232._16_4_ + auVar232._16_4_;
    fStack_5cc = auVar232._20_4_ + auVar232._20_4_;
    fStack_5c8 = auVar232._24_4_ + auVar232._24_4_;
    fStack_5c4 = auVar232._28_4_ + auVar232._28_4_;
    auVar116 = vsubps_avx(auVar10,auVar44);
    auVar123 = ZEXT1632(auVar112);
    local_5a0._28_4_ = fStack_564;
    local_5a0._0_28_ =
         ZEXT1628(CONCAT412(fVar104 * fVar104,
                            CONCAT48(fVar279 * fVar279,CONCAT44(fVar278 * fVar278,fVar277 * fVar277)
                                    )));
    local_b00 = vsubps_avx(local_240,local_5a0);
    local_700._4_4_ = (float)local_5e0._4_4_ * (float)local_5e0._4_4_;
    local_700._0_4_ = (float)local_5e0._0_4_ * (float)local_5e0._0_4_;
    local_700._8_4_ = fStack_5d8 * fStack_5d8;
    local_700._12_4_ = fStack_5d4 * fStack_5d4;
    local_700._16_4_ = fStack_5d0 * fStack_5d0;
    local_700._20_4_ = fStack_5cc * fStack_5cc;
    local_700._24_4_ = fStack_5c8 * fStack_5c8;
    local_700._28_4_ = auVar124._28_4_;
    fVar213 = local_b00._0_4_;
    local_740 = fVar213 * 4.0;
    fVar214 = local_b00._4_4_;
    fStack_73c = fVar214 * 4.0;
    fVar216 = local_b00._8_4_;
    fStack_738 = fVar216 * 4.0;
    fVar277 = local_b00._12_4_;
    fStack_734 = fVar277 * 4.0;
    fVar278 = local_b00._16_4_;
    fStack_730 = fVar278 * 4.0;
    fVar279 = local_b00._20_4_;
    fStack_72c = fVar279 * 4.0;
    fVar104 = local_b00._24_4_;
    fStack_728 = fVar104 * 4.0;
    fStack_724 = 4.0;
    auVar45._4_4_ = fStack_73c * auVar116._4_4_;
    auVar45._0_4_ = local_740 * auVar116._0_4_;
    auVar45._8_4_ = fStack_738 * auVar116._8_4_;
    auVar45._12_4_ = fStack_734 * auVar116._12_4_;
    auVar45._16_4_ = fStack_730 * auVar116._16_4_;
    auVar45._20_4_ = fStack_72c * auVar116._20_4_;
    fVar201 = local_b00._28_4_;
    auVar45._24_4_ = fStack_728 * auVar116._24_4_;
    auVar45._28_4_ = fVar201;
    auVar13 = local_700;
    auVar232 = vsubps_avx(local_700,auVar45);
    auVar124 = vcmpps_avx(auVar232,auVar267,5);
    local_5c0 = ZEXT1632(auVar256);
    if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar124 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar124 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar124 >> 0x7f,0) == '\0') &&
          (auVar124 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar124 >> 0xbf,0) == '\0') &&
        (auVar124 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar124[0x1f])
    {
      auVar234 = ZEXT3264(CONCAT428(0x7f800000,
                                    CONCAT424(0x7f800000,
                                              CONCAT420(0x7f800000,
                                                        CONCAT416(0x7f800000,
                                                                  CONCAT412(0x7f800000,
                                                                            CONCAT48(0x7f800000,
                                                                                                                                                                          
                                                  0x7f8000007f800000)))))));
      auVar118._8_4_ = 0xff800000;
      auVar118._0_8_ = 0xff800000ff800000;
      auVar118._12_4_ = 0xff800000;
      auVar118._16_4_ = 0xff800000;
      auVar118._20_4_ = 0xff800000;
      auVar118._24_4_ = 0xff800000;
      auVar118._28_4_ = 0xff800000;
    }
    else {
      _local_8e0 = auVar10;
      auVar267 = vcmpps_avx(auVar232,auVar267,5);
      auVar147 = vsqrtps_avx(auVar232);
      auVar259 = ZEXT3264(local_b00);
      auVar280._0_4_ = fVar213 + fVar213;
      auVar280._4_4_ = fVar214 + fVar214;
      auVar280._8_4_ = fVar216 + fVar216;
      auVar280._12_4_ = fVar277 + fVar277;
      auVar280._16_4_ = fVar278 + fVar278;
      auVar280._20_4_ = fVar279 + fVar279;
      auVar280._24_4_ = fVar104 + fVar104;
      auVar280._28_4_ = fVar201 + fVar201;
      auVar232 = vrcpps_avx(auVar280);
      auVar119._8_4_ = 0x3f800000;
      auVar119._0_8_ = &DAT_3f8000003f800000;
      auVar119._12_4_ = 0x3f800000;
      auVar119._16_4_ = 0x3f800000;
      auVar119._20_4_ = 0x3f800000;
      auVar119._24_4_ = 0x3f800000;
      auVar119._28_4_ = 0x3f800000;
      auVar112 = vfnmadd213ps_fma(auVar280,auVar232,auVar119);
      auVar112 = vfmadd132ps_fma(ZEXT1632(auVar112),auVar232,auVar232);
      auVar268._0_4_ = local_5e0._0_4_ ^ local_640;
      auVar268._4_4_ = local_5e0._4_4_ ^ uStack_63c;
      auVar268._8_4_ = (uint)fStack_5d8 ^ uStack_638;
      auVar268._12_4_ = (uint)fStack_5d4 ^ uStack_634;
      auVar268._16_4_ = (uint)fStack_5d0 ^ (uint)fStack_630;
      auVar268._20_4_ = (uint)fStack_5cc ^ (uint)fStack_62c;
      auVar268._24_4_ = (uint)fStack_5c8 ^ (uint)fStack_628;
      auVar268._28_4_ = (uint)fStack_5c4 ^ uStack_624;
      auVar232 = vsubps_avx(auVar268,auVar147);
      auVar46._4_4_ = auVar232._4_4_ * auVar112._4_4_;
      auVar46._0_4_ = auVar232._0_4_ * auVar112._0_4_;
      auVar46._8_4_ = auVar232._8_4_ * auVar112._8_4_;
      auVar46._12_4_ = auVar232._12_4_ * auVar112._12_4_;
      auVar46._16_4_ = auVar232._16_4_ * 0.0;
      auVar46._20_4_ = auVar232._20_4_ * 0.0;
      auVar46._24_4_ = auVar232._24_4_ * 0.0;
      auVar46._28_4_ = auVar232._28_4_;
      auVar232 = vsubps_avx(auVar147,_local_5e0);
      auVar47._4_4_ = auVar112._4_4_ * auVar232._4_4_;
      auVar47._0_4_ = auVar112._0_4_ * auVar232._0_4_;
      auVar47._8_4_ = auVar112._8_4_ * auVar232._8_4_;
      auVar47._12_4_ = auVar112._12_4_ * auVar232._12_4_;
      auVar47._16_4_ = auVar232._16_4_ * 0.0;
      auVar47._20_4_ = auVar232._20_4_ * 0.0;
      auVar47._24_4_ = auVar232._24_4_ * 0.0;
      auVar47._28_4_ = auVar232._28_4_;
      auVar112 = vfmadd213ps_fma(auVar123,auVar46,local_5c0);
      local_500 = ZEXT1632(CONCAT412(auVar112._12_4_ * fVar161,
                                     CONCAT48(auVar112._8_4_ * fVar136,
                                              CONCAT44(auVar112._4_4_ * fVar135,
                                                       auVar112._0_4_ * fVar134))));
      auVar112 = vfmadd213ps_fma(auVar123,auVar47,local_5c0);
      local_520 = ZEXT1632(CONCAT412(auVar112._12_4_ * fVar161,
                                     CONCAT48(auVar112._8_4_ * fVar136,
                                              CONCAT44(auVar112._4_4_ * fVar135,
                                                       auVar112._0_4_ * fVar134))));
      auVar120._8_4_ = 0x7f800000;
      auVar120._0_8_ = 0x7f8000007f800000;
      auVar120._12_4_ = 0x7f800000;
      auVar120._16_4_ = 0x7f800000;
      auVar120._20_4_ = 0x7f800000;
      auVar120._24_4_ = 0x7f800000;
      auVar120._28_4_ = 0x7f800000;
      _local_880 = vblendvps_avx(auVar120,auVar46,auVar267);
      auVar232 = vandps_avx(local_7c0,local_5a0);
      auVar232 = vmaxps_avx(local_460,auVar232);
      auVar48._4_4_ = auVar232._4_4_ * 1.9073486e-06;
      auVar48._0_4_ = auVar232._0_4_ * 1.9073486e-06;
      auVar48._8_4_ = auVar232._8_4_ * 1.9073486e-06;
      auVar48._12_4_ = auVar232._12_4_ * 1.9073486e-06;
      auVar48._16_4_ = auVar232._16_4_ * 1.9073486e-06;
      auVar48._20_4_ = auVar232._20_4_ * 1.9073486e-06;
      auVar48._24_4_ = auVar232._24_4_ * 1.9073486e-06;
      auVar48._28_4_ = auVar232._28_4_;
      auVar232 = vandps_avx(local_b00,local_7c0);
      auVar273 = ZEXT3264(auVar232);
      auVar232 = vcmpps_avx(auVar232,auVar48,1);
      auVar121._8_4_ = 0xff800000;
      auVar121._0_8_ = 0xff800000ff800000;
      auVar121._12_4_ = 0xff800000;
      auVar121._16_4_ = 0xff800000;
      auVar121._20_4_ = 0xff800000;
      auVar121._24_4_ = 0xff800000;
      auVar121._28_4_ = 0xff800000;
      auVar118 = vblendvps_avx(auVar121,auVar47,auVar267);
      auVar147 = auVar267 & auVar232;
      if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar147 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar147 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar147 >> 0x7f,0) == '\0') &&
            (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar147 >> 0xbf,0) == '\0') &&
          (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar147[0x1f]) {
        auVar234 = ZEXT3264(_local_880);
      }
      else {
        auVar124 = vandps_avx(auVar232,auVar267);
        auVar147 = vcmpps_avx(auVar116,_DAT_02020f00,2);
        auVar128._8_4_ = 0xff800000;
        auVar128._0_8_ = 0xff800000ff800000;
        auVar128._12_4_ = 0xff800000;
        auVar128._16_4_ = 0xff800000;
        auVar128._20_4_ = 0xff800000;
        auVar128._24_4_ = 0xff800000;
        auVar128._28_4_ = 0xff800000;
        auVar281._8_4_ = 0x7f800000;
        auVar281._0_8_ = 0x7f8000007f800000;
        auVar281._12_4_ = 0x7f800000;
        auVar281._16_4_ = 0x7f800000;
        auVar281._20_4_ = 0x7f800000;
        auVar281._24_4_ = 0x7f800000;
        auVar281._28_4_ = 0x7f800000;
        auVar116 = vblendvps_avx(auVar281,auVar128,auVar147);
        auVar112 = vpackssdw_avx(auVar124._0_16_,auVar124._16_16_);
        auVar171 = vpmovsxwd_avx2(auVar112);
        auVar116 = vblendvps_avx(_local_880,auVar116,auVar171);
        auVar259 = ZEXT3264(auVar116);
        auVar232 = vblendvps_avx(auVar128,auVar281,auVar147);
        auVar273 = ZEXT3264(auVar232);
        auVar118 = vblendvps_avx(auVar118,auVar232,auVar171);
        auVar234 = ZEXT3264(auVar116);
        auVar211._0_8_ = auVar124._0_8_ ^ 0xffffffffffffffff;
        auVar211._8_4_ = auVar124._8_4_ ^ 0xffffffff;
        auVar211._12_4_ = auVar124._12_4_ ^ 0xffffffff;
        auVar211._16_4_ = auVar124._16_4_ ^ 0xffffffff;
        auVar211._20_4_ = auVar124._20_4_ ^ 0xffffffff;
        auVar211._24_4_ = auVar124._24_4_ ^ 0xffffffff;
        auVar211._28_4_ = auVar124._28_4_ ^ 0xffffffff;
        auVar124 = vorps_avx(auVar147,auVar211);
        auVar124 = vandps_avx(auVar267,auVar124);
      }
    }
    auVar248 = ZEXT3264(auVar10);
    auVar116 = local_440 & auVar124;
    if ((((((((auVar116 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar116 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar116 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar116 >> 0x7f,0) != '\0') ||
          (auVar116 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar116 >> 0xbf,0) != '\0') ||
        (auVar116 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar116[0x1f] < '\0') {
      _local_880 = auVar123;
      fVar131 = (ray->super_RayK<1>).org.field_0.m128[3] - (float)local_7f0._0_4_;
      auVar197._4_4_ = fVar131;
      auVar197._0_4_ = fVar131;
      auVar197._8_4_ = fVar131;
      auVar197._12_4_ = fVar131;
      auVar197._16_4_ = fVar131;
      auVar197._20_4_ = fVar131;
      auVar197._24_4_ = fVar131;
      auVar197._28_4_ = fVar131;
      _local_8e0 = vmaxps_avx(auVar197,auVar234._0_32_);
      auVar49._4_4_ = local_9e0._4_4_ * fVar215;
      auVar49._0_4_ = (float)local_9e0._0_4_ * fVar212;
      auVar49._8_4_ = local_9e0._8_4_ * fVar235;
      auVar49._12_4_ = local_9e0._12_4_ * fVar265;
      auVar49._16_4_ = local_9e0._16_4_ * fVar275;
      auVar49._20_4_ = local_9e0._20_4_ * fVar274;
      auVar49._24_4_ = local_9e0._24_4_ * fVar276;
      auVar49._28_4_ = auVar9._28_4_;
      auVar112 = vfmadd213ps_fma(auVar11,local_6c0,auVar49);
      fVar212 = (ray->super_RayK<1>).tfar - (float)local_7f0._0_4_;
      auVar198._4_4_ = fVar212;
      auVar198._0_4_ = fVar212;
      auVar198._8_4_ = fVar212;
      auVar198._12_4_ = fVar212;
      auVar198._16_4_ = fVar212;
      auVar198._20_4_ = fVar212;
      auVar198._24_4_ = fVar212;
      auVar198._28_4_ = fVar212;
      auVar256 = vfmadd213ps_fma(auVar149,local_a60,ZEXT1632(auVar112));
      auVar225 = ZEXT3264(CONCAT428(fStack_564,
                                    CONCAT424(fStack_568,
                                              CONCAT420(fStack_56c,
                                                        CONCAT416(fStack_570,
                                                                  CONCAT412(fStack_574,
                                                                            CONCAT48(fStack_578,
                                                                                     CONCAT44(
                                                  fStack_57c,local_580))))))));
      auVar294._0_4_ = local_580 * (float)local_9e0._0_4_;
      auVar294._4_4_ = fStack_57c * local_9e0._4_4_;
      auVar294._8_4_ = fStack_578 * local_9e0._8_4_;
      auVar294._12_4_ = fStack_574 * local_9e0._12_4_;
      auVar294._16_4_ = fStack_570 * local_9e0._16_4_;
      auVar294._20_4_ = fStack_56c * local_9e0._20_4_;
      auVar294._28_36_ = auVar234._28_36_;
      auVar294._24_4_ = fStack_568 * local_9e0._24_4_;
      auVar112 = vfmadd231ps_fma(auVar294._0_32_,_local_560,local_6c0);
      auVar139 = vfmadd231ps_fma(ZEXT1632(auVar112),_local_540,local_a60);
      auVar116 = vandps_avx(ZEXT1632(auVar139),local_7c0);
      auVar262._8_4_ = 0x219392ef;
      auVar262._0_8_ = 0x219392ef219392ef;
      auVar262._12_4_ = 0x219392ef;
      auVar262._16_4_ = 0x219392ef;
      auVar262._20_4_ = 0x219392ef;
      auVar262._24_4_ = 0x219392ef;
      auVar262._28_4_ = 0x219392ef;
      auVar9 = vcmpps_avx(auVar116,auVar262,1);
      auVar116 = vrcpps_avx(ZEXT1632(auVar139));
      auVar290._8_4_ = 0x3f800000;
      auVar290._0_8_ = &DAT_3f8000003f800000;
      auVar290._12_4_ = 0x3f800000;
      auVar290._16_4_ = 0x3f800000;
      auVar290._20_4_ = 0x3f800000;
      auVar290._24_4_ = 0x3f800000;
      auVar290._28_4_ = 0x3f800000;
      auVar149 = ZEXT1632(auVar139);
      auVar112 = vfnmadd213ps_fma(auVar116,auVar149,auVar290);
      auVar112 = vfmadd132ps_fma(ZEXT1632(auVar112),auVar116,auVar116);
      auVar269._0_4_ = auVar139._0_4_ ^ local_640;
      auVar269._4_4_ = auVar139._4_4_ ^ uStack_63c;
      auVar269._8_4_ = auVar139._8_4_ ^ uStack_638;
      auVar269._12_4_ = auVar139._12_4_ ^ uStack_634;
      auVar269._16_4_ = fStack_630;
      auVar269._20_4_ = fStack_62c;
      auVar269._24_4_ = fStack_628;
      auVar269._28_4_ = uStack_624;
      auVar50._4_4_ = auVar112._4_4_ * (float)(auVar256._4_4_ ^ uStack_63c);
      auVar50._0_4_ = auVar112._0_4_ * (float)(auVar256._0_4_ ^ local_640);
      auVar50._8_4_ = auVar112._8_4_ * (float)(auVar256._8_4_ ^ uStack_638);
      auVar50._12_4_ = auVar112._12_4_ * (float)(auVar256._12_4_ ^ uStack_634);
      auVar50._16_4_ = fStack_630 * 0.0;
      auVar50._20_4_ = fStack_62c * 0.0;
      auVar50._24_4_ = fStack_628 * 0.0;
      auVar50._28_4_ = uStack_624;
      auVar116 = vcmpps_avx(auVar149,auVar269,1);
      auVar116 = vorps_avx(auVar9,auVar116);
      auVar293._8_4_ = 0xff800000;
      auVar293._0_8_ = 0xff800000ff800000;
      auVar293._12_4_ = 0xff800000;
      auVar293._16_4_ = 0xff800000;
      auVar293._20_4_ = 0xff800000;
      auVar293._24_4_ = 0xff800000;
      auVar293._28_4_ = 0xff800000;
      auVar116 = vblendvps_avx(auVar50,auVar293,auVar116);
      auVar11 = vminps_avx(auVar198,auVar118);
      local_a60 = vmaxps_avx(_local_8e0,auVar116);
      auVar116 = vcmpps_avx(auVar149,auVar269,6);
      auVar116 = vorps_avx(auVar9,auVar116);
      auVar257._8_4_ = 0x7f800000;
      auVar257._0_8_ = 0x7f8000007f800000;
      auVar257._12_4_ = 0x7f800000;
      auVar257._16_4_ = 0x7f800000;
      auVar257._20_4_ = 0x7f800000;
      auVar257._24_4_ = 0x7f800000;
      auVar257._28_4_ = 0x7f800000;
      auVar259 = ZEXT3264(auVar257);
      auVar116 = vblendvps_avx(auVar50,auVar257,auVar116);
      auVar11 = vminps_avx(auVar11,auVar116);
      auVar294 = ZEXT864(0) << 0x20;
      auVar116 = vsubps_avx(ZEXT832(0) << 0x20,local_900);
      auVar9 = vsubps_avx(ZEXT832(0) << 0x20,local_820);
      auVar51._4_4_ = auVar9._4_4_ * fVar180;
      auVar51._0_4_ = auVar9._0_4_ * fVar179;
      auVar51._8_4_ = auVar9._8_4_ * fVar181;
      auVar51._12_4_ = auVar9._12_4_ * fVar243;
      auVar51._16_4_ = auVar9._16_4_ * fVar249;
      auVar51._20_4_ = auVar9._20_4_ * fVar250;
      auVar51._24_4_ = auVar9._24_4_ * fVar251;
      auVar51._28_4_ = auVar9._28_4_;
      auVar112 = vfnmsub231ps_fma(auVar51,local_a00,auVar116);
      auVar267 = ZEXT832(0) << 0x20;
      auVar116 = vsubps_avx(auVar267,_local_960);
      auVar256 = vfnmadd231ps_fma(ZEXT1632(auVar112),local_920,auVar116);
      auVar52._4_4_ = fVar180 * fStack_57c;
      auVar52._0_4_ = fVar179 * local_580;
      auVar52._8_4_ = fVar181 * fStack_578;
      auVar52._12_4_ = fVar243 * fStack_574;
      auVar52._16_4_ = fVar249 * fStack_570;
      auVar52._20_4_ = fVar250 * fStack_56c;
      auVar52._24_4_ = fVar251 * fStack_568;
      auVar52._28_4_ = auVar116._28_4_;
      auVar112 = vfnmsub231ps_fma(auVar52,_local_560,local_a00);
      auVar139 = vfnmadd231ps_fma(ZEXT1632(auVar112),_local_540,local_920);
      auVar234 = ZEXT1664(auVar139);
      auVar116 = vandps_avx(ZEXT1632(auVar139),local_7c0);
      auVar149 = vrcpps_avx(ZEXT1632(auVar139));
      auVar148._8_4_ = 0x219392ef;
      auVar148._0_8_ = 0x219392ef219392ef;
      auVar148._12_4_ = 0x219392ef;
      auVar148._16_4_ = 0x219392ef;
      auVar148._20_4_ = 0x219392ef;
      auVar148._24_4_ = 0x219392ef;
      auVar148._28_4_ = 0x219392ef;
      auVar9 = vcmpps_avx(auVar116,auVar148,1);
      auVar264 = ZEXT3264(auVar9);
      auVar232 = ZEXT1632(auVar139);
      auVar112 = vfnmadd213ps_fma(auVar149,auVar232,auVar290);
      auVar112 = vfmadd132ps_fma(ZEXT1632(auVar112),auVar149,auVar149);
      auVar270._0_4_ = auVar139._0_4_ ^ local_640;
      auVar270._4_4_ = auVar139._4_4_ ^ uStack_63c;
      auVar270._8_4_ = auVar139._8_4_ ^ uStack_638;
      auVar270._12_4_ = auVar139._12_4_ ^ uStack_634;
      auVar270._16_4_ = fStack_630;
      auVar270._20_4_ = fStack_62c;
      auVar270._24_4_ = fStack_628;
      auVar270._28_4_ = uStack_624;
      auVar273 = ZEXT3264(auVar270);
      auVar53._4_4_ = auVar112._4_4_ * (float)(auVar256._4_4_ ^ uStack_63c);
      auVar53._0_4_ = auVar112._0_4_ * (float)(auVar256._0_4_ ^ local_640);
      auVar53._8_4_ = auVar112._8_4_ * (float)(auVar256._8_4_ ^ uStack_638);
      auVar53._12_4_ = auVar112._12_4_ * (float)(auVar256._12_4_ ^ uStack_634);
      auVar53._16_4_ = fStack_630 * 0.0;
      auVar53._20_4_ = fStack_62c * 0.0;
      auVar53._24_4_ = fStack_628 * 0.0;
      auVar53._28_4_ = uStack_624;
      auVar116 = vcmpps_avx(auVar232,auVar270,1);
      auVar116 = vorps_avx(auVar9,auVar116);
      auVar122._8_4_ = 0xff800000;
      auVar122._0_8_ = 0xff800000ff800000;
      auVar122._12_4_ = 0xff800000;
      auVar122._16_4_ = 0xff800000;
      auVar122._20_4_ = 0xff800000;
      auVar122._24_4_ = 0xff800000;
      auVar122._28_4_ = 0xff800000;
      auVar116 = vblendvps_avx(auVar53,auVar122,auVar116);
      _local_8e0 = vmaxps_avx(local_a60,auVar116);
      auVar116 = vcmpps_avx(auVar232,auVar270,6);
      auVar116 = vorps_avx(auVar9,auVar116);
      auVar116 = vblendvps_avx(auVar53,auVar257,auVar116);
      auVar124 = vandps_avx(auVar124,local_440);
      local_4c0 = vminps_avx(auVar11,auVar116);
      auVar116 = vcmpps_avx(_local_8e0,local_4c0,2);
      auVar9 = auVar124 & auVar116;
      if ((((((((auVar9 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar9 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar9 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar9 >> 0x7f,0) != '\0') ||
            (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar9 >> 0xbf,0) != '\0') ||
          (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar9[0x1f] < '\0')
      {
        auVar232 = _local_8e0;
        auVar9 = vminps_avx(local_500,auVar290);
        auVar66 = ZEXT812(0);
        auVar149 = ZEXT1232(auVar66) << 0x20;
        auVar9 = vmaxps_avx(auVar9,ZEXT1232(auVar66) << 0x20);
        auVar11 = vminps_avx(local_520,auVar290);
        auVar11 = vmaxps_avx(auVar11,ZEXT1232(auVar66) << 0x20);
        auVar54._4_4_ = (auVar9._4_4_ + 1.0) * 0.125;
        auVar54._0_4_ = (auVar9._0_4_ + 0.0) * 0.125;
        auVar54._8_4_ = (auVar9._8_4_ + 2.0) * 0.125;
        auVar54._12_4_ = (auVar9._12_4_ + 3.0) * 0.125;
        auVar54._16_4_ = (auVar9._16_4_ + 4.0) * 0.125;
        auVar54._20_4_ = (auVar9._20_4_ + 5.0) * 0.125;
        auVar54._24_4_ = (auVar9._24_4_ + 6.0) * 0.125;
        auVar54._28_4_ = auVar9._28_4_ + 7.0;
        auVar112 = vfmadd213ps_fma(auVar54,local_860,local_940);
        auVar55._4_4_ = (auVar11._4_4_ + 1.0) * 0.125;
        auVar55._0_4_ = (auVar11._0_4_ + 0.0) * 0.125;
        auVar55._8_4_ = (auVar11._8_4_ + 2.0) * 0.125;
        auVar55._12_4_ = (auVar11._12_4_ + 3.0) * 0.125;
        auVar55._16_4_ = (auVar11._16_4_ + 4.0) * 0.125;
        auVar55._20_4_ = (auVar11._20_4_ + 5.0) * 0.125;
        auVar55._24_4_ = (auVar11._24_4_ + 6.0) * 0.125;
        auVar55._28_4_ = auVar11._28_4_ + 7.0;
        auVar256 = vfmadd213ps_fma(auVar55,local_860,local_940);
        auVar9 = vminps_avx(local_980,local_8a0);
        auVar11 = vminps_avx(_local_8c0,local_6e0);
        auVar9 = vminps_avx(auVar9,auVar11);
        auVar9 = vsubps_avx(auVar9,local_720);
        auVar124 = vandps_avx(auVar116,auVar124);
        local_500 = ZEXT1632(auVar112);
        local_520 = ZEXT1632(auVar256);
        auVar56._4_4_ = auVar9._4_4_ * 0.99999976;
        auVar56._0_4_ = auVar9._0_4_ * 0.99999976;
        auVar56._8_4_ = auVar9._8_4_ * 0.99999976;
        auVar56._12_4_ = auVar9._12_4_ * 0.99999976;
        auVar56._16_4_ = auVar9._16_4_ * 0.99999976;
        auVar56._20_4_ = auVar9._20_4_ * 0.99999976;
        auVar56._24_4_ = auVar9._24_4_ * 0.99999976;
        auVar56._28_4_ = auVar9._28_4_;
        auVar116 = vmaxps_avx(auVar267,auVar56);
        auVar57._4_4_ = auVar116._4_4_ * auVar116._4_4_;
        auVar57._0_4_ = auVar116._0_4_ * auVar116._0_4_;
        auVar57._8_4_ = auVar116._8_4_ * auVar116._8_4_;
        auVar57._12_4_ = auVar116._12_4_ * auVar116._12_4_;
        auVar57._16_4_ = auVar116._16_4_ * auVar116._16_4_;
        auVar57._20_4_ = auVar116._20_4_ * auVar116._20_4_;
        auVar57._24_4_ = auVar116._24_4_ * auVar116._24_4_;
        auVar57._28_4_ = auVar116._28_4_;
        auVar9 = vsubps_avx(auVar10,auVar57);
        auVar58._4_4_ = auVar9._4_4_ * fStack_73c;
        auVar58._0_4_ = auVar9._0_4_ * local_740;
        auVar58._8_4_ = auVar9._8_4_ * fStack_738;
        auVar58._12_4_ = auVar9._12_4_ * fStack_734;
        auVar58._16_4_ = auVar9._16_4_ * fStack_730;
        auVar58._20_4_ = auVar9._20_4_ * fStack_72c;
        auVar58._24_4_ = auVar9._24_4_ * fStack_728;
        auVar58._28_4_ = auVar116._28_4_;
        auVar11 = vsubps_avx(local_700,auVar58);
        auVar116 = vcmpps_avx(auVar11,ZEXT1232(auVar66) << 0x20,5);
        auVar225 = ZEXT3264(auVar116);
        if ((((((((auVar116 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar116 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar116 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar116 >> 0x7f,0) == '\0') &&
              (auVar116 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar116 >> 0xbf,0) == '\0') &&
            (auVar116 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar116[0x1f]) {
          auVar123 = SUB6432(ZEXT864(0),0) << 0x20;
          local_680 = ZEXT832(0) << 0x20;
          local_6a0 = ZEXT832(0) << 0x20;
          _local_880 = ZEXT832(0) << 0x20;
          auVar177 = ZEXT864(0) << 0x20;
          auVar233._8_4_ = 0x7f800000;
          auVar233._0_8_ = 0x7f8000007f800000;
          auVar233._12_4_ = 0x7f800000;
          auVar233._16_4_ = 0x7f800000;
          auVar233._20_4_ = 0x7f800000;
          auVar233._24_4_ = 0x7f800000;
          auVar233._28_4_ = 0x7f800000;
          auVar238._8_4_ = 0xff800000;
          auVar238._0_8_ = 0xff800000ff800000;
          auVar238._12_4_ = 0xff800000;
          auVar238._16_4_ = 0xff800000;
          auVar238._20_4_ = 0xff800000;
          auVar238._24_4_ = 0xff800000;
          auVar238._28_4_ = 0xff800000;
        }
        else {
          local_900 = auVar116;
          _local_960 = auVar124;
          auVar147 = vsqrtps_avx(auVar11);
          auVar239._0_4_ = fVar213 + fVar213;
          auVar239._4_4_ = fVar214 + fVar214;
          auVar239._8_4_ = fVar216 + fVar216;
          auVar239._12_4_ = fVar277 + fVar277;
          auVar239._16_4_ = fVar278 + fVar278;
          auVar239._20_4_ = fVar279 + fVar279;
          auVar239._24_4_ = fVar104 + fVar104;
          auVar239._28_4_ = fVar201 + fVar201;
          auVar149 = vrcpps_avx(auVar239);
          auVar112 = vfnmadd213ps_fma(auVar239,auVar149,auVar290);
          auVar112 = vfmadd132ps_fma(ZEXT1632(auVar112),auVar149,auVar149);
          auVar271._0_4_ = local_5e0._0_4_ ^ local_640;
          auVar271._4_4_ = local_5e0._4_4_ ^ uStack_63c;
          auVar271._8_4_ = (uint)fStack_5d8 ^ uStack_638;
          auVar271._12_4_ = (uint)fStack_5d4 ^ uStack_634;
          auVar271._16_4_ = (uint)fStack_5d0 ^ (uint)fStack_630;
          auVar271._20_4_ = (uint)fStack_5cc ^ (uint)fStack_62c;
          auVar271._24_4_ = (uint)fStack_5c8 ^ (uint)fStack_628;
          auVar271._28_4_ = (uint)fStack_5c4 ^ uStack_624;
          auVar149 = vsubps_avx(auVar271,auVar147);
          auVar171 = vsubps_avx(auVar147,_local_5e0);
          fVar201 = auVar149._0_4_ * auVar112._0_4_;
          fVar212 = auVar149._4_4_ * auVar112._4_4_;
          auVar59._4_4_ = fVar212;
          auVar59._0_4_ = fVar201;
          fVar213 = auVar149._8_4_ * auVar112._8_4_;
          auVar59._8_4_ = fVar213;
          fVar215 = auVar149._12_4_ * auVar112._12_4_;
          auVar59._12_4_ = fVar215;
          fVar214 = auVar149._16_4_ * 0.0;
          auVar59._16_4_ = fVar214;
          fVar235 = auVar149._20_4_ * 0.0;
          auVar59._20_4_ = fVar235;
          fVar216 = auVar149._24_4_ * 0.0;
          auVar59._24_4_ = fVar216;
          auVar59._28_4_ = auVar147._28_4_;
          fVar265 = auVar171._0_4_ * auVar112._0_4_;
          fVar274 = auVar171._4_4_ * auVar112._4_4_;
          auVar60._4_4_ = fVar274;
          auVar60._0_4_ = fVar265;
          fVar275 = auVar171._8_4_ * auVar112._8_4_;
          auVar60._8_4_ = fVar275;
          fVar276 = auVar171._12_4_ * auVar112._12_4_;
          auVar60._12_4_ = fVar276;
          fVar277 = auVar171._16_4_ * 0.0;
          auVar60._16_4_ = fVar277;
          fVar278 = auVar171._20_4_ * 0.0;
          auVar60._20_4_ = fVar278;
          fVar279 = auVar171._24_4_ * 0.0;
          auVar60._24_4_ = fVar279;
          auVar60._28_4_ = auVar149._28_4_;
          auVar112 = vfmadd213ps_fma(auVar123,auVar59,local_5c0);
          auVar256 = vfmadd213ps_fma(auVar123,auVar60,local_5c0);
          auVar149 = ZEXT1632(CONCAT412(auVar112._12_4_ * fVar161,
                                        CONCAT48(auVar112._8_4_ * fVar136,
                                                 CONCAT44(auVar112._4_4_ * fVar135,
                                                          auVar112._0_4_ * fVar134))));
          auVar95._28_4_ = auVar10._28_4_;
          auVar95._0_28_ =
               ZEXT1628(CONCAT412(fVar161 * auVar256._12_4_,
                                  CONCAT48(fVar136 * auVar256._8_4_,
                                           CONCAT44(fVar135 * auVar256._4_4_,
                                                    fVar134 * auVar256._0_4_))));
          auVar112 = vfmadd213ps_fma(local_680,auVar149,local_ae0);
          auVar256 = vfmadd213ps_fma(local_680,auVar95,local_ae0);
          auVar139 = vfmadd213ps_fma(local_6a0,auVar149,local_660);
          auVar3 = vfmadd213ps_fma(local_6a0,auVar95,local_660);
          auVar165 = vfmadd213ps_fma(auVar149,_local_7a0,local_780);
          auVar144 = vfmadd213ps_fma(_local_7a0,auVar95,local_780);
          auVar61._4_4_ = (float)local_540._4_4_ * fVar212;
          auVar61._0_4_ = (float)local_540._0_4_ * fVar201;
          auVar61._8_4_ = fStack_538 * fVar213;
          auVar61._12_4_ = fStack_534 * fVar215;
          auVar61._16_4_ = fStack_530 * fVar214;
          auVar61._20_4_ = fStack_52c * fVar235;
          auVar61._24_4_ = fStack_528 * fVar216;
          auVar61._28_4_ = 0;
          auVar123 = vsubps_avx(auVar61,ZEXT1632(auVar112));
          auVar150._0_4_ = (float)local_560._0_4_ * fVar201;
          auVar150._4_4_ = (float)local_560._4_4_ * fVar212;
          auVar150._8_4_ = fStack_558 * fVar213;
          auVar150._12_4_ = fStack_554 * fVar215;
          auVar150._16_4_ = fStack_550 * fVar214;
          auVar150._20_4_ = fStack_54c * fVar235;
          auVar150._24_4_ = fStack_548 * fVar216;
          auVar150._28_4_ = 0;
          auVar149 = vsubps_avx(auVar150,ZEXT1632(auVar139));
          auVar172._0_4_ = local_580 * fVar201;
          auVar172._4_4_ = fStack_57c * fVar212;
          auVar172._8_4_ = fStack_578 * fVar213;
          auVar172._12_4_ = fStack_574 * fVar215;
          auVar172._16_4_ = fStack_570 * fVar214;
          auVar172._20_4_ = fStack_56c * fVar235;
          auVar172._24_4_ = fStack_568 * fVar216;
          auVar172._28_4_ = 0;
          auVar10 = vsubps_avx(auVar172,ZEXT1632(auVar165));
          auVar177 = ZEXT3264(auVar10);
          auVar240._0_4_ = (float)local_540._0_4_ * fVar265;
          auVar240._4_4_ = (float)local_540._4_4_ * fVar274;
          auVar240._8_4_ = fStack_538 * fVar275;
          auVar240._12_4_ = fStack_534 * fVar276;
          auVar240._16_4_ = fStack_530 * fVar277;
          auVar240._20_4_ = fStack_52c * fVar278;
          auVar240._24_4_ = fStack_528 * fVar279;
          auVar240._28_4_ = 0;
          local_680 = vsubps_avx(auVar240,ZEXT1632(auVar256));
          auVar62._4_4_ = fVar274 * (float)local_560._4_4_;
          auVar62._0_4_ = fVar265 * (float)local_560._0_4_;
          auVar62._8_4_ = fVar275 * fStack_558;
          auVar62._12_4_ = fVar276 * fStack_554;
          auVar62._16_4_ = fVar277 * fStack_550;
          auVar62._20_4_ = fVar278 * fStack_54c;
          auVar62._24_4_ = fVar279 * fStack_548;
          auVar62._28_4_ = local_680._28_4_;
          local_6a0 = vsubps_avx(auVar62,ZEXT1632(auVar3));
          auVar63._4_4_ = fStack_57c * fVar274;
          auVar63._0_4_ = local_580 * fVar265;
          auVar63._8_4_ = fStack_578 * fVar275;
          auVar63._12_4_ = fStack_574 * fVar276;
          auVar63._16_4_ = fStack_570 * fVar277;
          auVar63._20_4_ = fStack_56c * fVar278;
          auVar63._24_4_ = fStack_568 * fVar279;
          auVar63._28_4_ = local_6a0._28_4_;
          _local_880 = vsubps_avx(auVar63,ZEXT1632(auVar144));
          auVar11 = vcmpps_avx(auVar11,auVar267,5);
          auVar241._8_4_ = 0x7f800000;
          auVar241._0_8_ = 0x7f8000007f800000;
          auVar241._12_4_ = 0x7f800000;
          auVar241._16_4_ = 0x7f800000;
          auVar241._20_4_ = 0x7f800000;
          auVar241._24_4_ = 0x7f800000;
          auVar241._28_4_ = 0x7f800000;
          auVar233 = vblendvps_avx(auVar241,auVar59,auVar11);
          auVar10 = vandps_avx(local_7c0,local_5a0);
          auVar10 = vmaxps_avx(local_460,auVar10);
          auVar64._4_4_ = auVar10._4_4_ * 1.9073486e-06;
          auVar64._0_4_ = auVar10._0_4_ * 1.9073486e-06;
          auVar64._8_4_ = auVar10._8_4_ * 1.9073486e-06;
          auVar64._12_4_ = auVar10._12_4_ * 1.9073486e-06;
          auVar64._16_4_ = auVar10._16_4_ * 1.9073486e-06;
          auVar64._20_4_ = auVar10._20_4_ * 1.9073486e-06;
          auVar64._24_4_ = auVar10._24_4_ * 1.9073486e-06;
          auVar64._28_4_ = auVar10._28_4_;
          auVar10 = vandps_avx(local_7c0,local_b00);
          auVar10 = vcmpps_avx(auVar10,auVar64,1);
          auVar242._8_4_ = 0xff800000;
          auVar242._0_8_ = 0xff800000ff800000;
          auVar242._12_4_ = 0xff800000;
          auVar242._16_4_ = 0xff800000;
          auVar242._20_4_ = 0xff800000;
          auVar242._24_4_ = 0xff800000;
          auVar242._28_4_ = 0xff800000;
          auVar238 = vblendvps_avx(auVar242,auVar60,auVar11);
          auVar267 = auVar11 & auVar10;
          if ((((((((auVar267 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar267 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar267 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar267 >> 0x7f,0) == '\0') &&
                (auVar267 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar267 >> 0xbf,0) == '\0') &&
              (auVar267 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar267[0x1f]) {
            auVar225 = ZEXT3264(auVar116);
          }
          else {
            auVar116 = vandps_avx(auVar10,auVar11);
            auVar10 = vcmpps_avx(auVar9,ZEXT832(0) << 0x20,2);
            auVar272._8_4_ = 0xff800000;
            auVar272._0_8_ = 0xff800000ff800000;
            auVar272._12_4_ = 0xff800000;
            auVar272._16_4_ = 0xff800000;
            auVar272._20_4_ = 0xff800000;
            auVar272._24_4_ = 0xff800000;
            auVar272._28_4_ = 0xff800000;
            auVar282._8_4_ = 0x7f800000;
            auVar282._0_8_ = 0x7f8000007f800000;
            auVar282._12_4_ = 0x7f800000;
            auVar282._16_4_ = 0x7f800000;
            auVar282._20_4_ = 0x7f800000;
            auVar282._24_4_ = 0x7f800000;
            auVar282._28_4_ = 0x7f800000;
            auVar9 = vblendvps_avx(auVar282,auVar272,auVar10);
            auVar112 = vpackssdw_avx(auVar116._0_16_,auVar116._16_16_);
            auVar267 = vpmovsxwd_avx2(auVar112);
            auVar233 = vblendvps_avx(auVar233,auVar9,auVar267);
            auVar9 = vblendvps_avx(auVar272,auVar282,auVar10);
            auVar238 = vblendvps_avx(auVar238,auVar9,auVar267);
            auVar224._0_8_ = auVar116._0_8_ ^ 0xffffffffffffffff;
            auVar224._8_4_ = auVar116._8_4_ ^ 0xffffffff;
            auVar224._12_4_ = auVar116._12_4_ ^ 0xffffffff;
            auVar224._16_4_ = auVar116._16_4_ ^ 0xffffffff;
            auVar224._20_4_ = auVar116._20_4_ ^ 0xffffffff;
            auVar224._24_4_ = auVar116._24_4_ ^ 0xffffffff;
            auVar224._28_4_ = auVar116._28_4_ ^ 0xffffffff;
            auVar116 = vorps_avx(auVar10,auVar224);
            auVar116 = vandps_avx(auVar11,auVar116);
            auVar225 = ZEXT3264(auVar116);
          }
        }
        uVar100 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
        auVar258._4_4_ = uVar100;
        auVar258._0_4_ = uVar100;
        auVar258._8_4_ = uVar100;
        auVar258._12_4_ = uVar100;
        auVar258._16_4_ = uVar100;
        auVar258._20_4_ = uVar100;
        auVar258._24_4_ = uVar100;
        auVar258._28_4_ = uVar100;
        auVar259 = ZEXT3264(auVar258);
        uVar100 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
        auVar263._4_4_ = uVar100;
        auVar263._0_4_ = uVar100;
        auVar263._8_4_ = uVar100;
        auVar263._12_4_ = uVar100;
        auVar263._16_4_ = uVar100;
        auVar263._20_4_ = uVar100;
        auVar263._24_4_ = uVar100;
        auVar263._28_4_ = uVar100;
        auVar264 = ZEXT3264(auVar263);
        fVar201 = (ray->super_RayK<1>).dir.field_0.m128[2];
        auVar248 = ZEXT3264(_local_8e0);
        local_4a0 = _local_8e0;
        local_480 = vminps_avx(local_4c0,auVar233);
        _local_4e0 = vmaxps_avx(_local_8e0,auVar238);
        auVar273 = ZEXT3264(_local_4e0);
        auVar116 = vcmpps_avx(_local_8e0,local_480,2);
        local_5a0 = vandps_avx(auVar116,auVar124);
        local_600 = local_5a0;
        auVar116 = vcmpps_avx(_local_4e0,local_4c0,2);
        local_620 = vandps_avx(auVar116,auVar124);
        auVar234 = ZEXT3264(local_620);
        auVar124 = vorps_avx(local_620,local_5a0);
        if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar124 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar124 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar124 >> 0x7f,0) != '\0') ||
              (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar124 >> 0xbf,0) != '\0') ||
            (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar124[0x1f] < '\0') {
          local_280 = local_620;
          _local_5e0 = _local_4e0;
          local_2a0._0_8_ = auVar225._0_8_ ^ 0xffffffffffffffff;
          local_2a0._8_4_ = auVar225._8_4_ ^ 0xffffffff;
          local_2a0._12_4_ = auVar225._12_4_ ^ 0xffffffff;
          local_2a0._16_4_ = auVar225._16_4_ ^ 0xffffffff;
          local_2a0._20_4_ = auVar225._20_4_ ^ 0xffffffff;
          local_2a0._24_4_ = auVar225._24_4_ ^ 0xffffffff;
          local_2a0._28_4_ = auVar225._28_4_ ^ 0xffffffff;
          auVar178._0_4_ = fVar201 * auVar177._0_4_;
          auVar178._4_4_ = fVar201 * auVar177._4_4_;
          auVar178._8_4_ = fVar201 * auVar177._8_4_;
          auVar178._12_4_ = fVar201 * auVar177._12_4_;
          auVar178._16_4_ = fVar201 * auVar177._16_4_;
          auVar178._20_4_ = fVar201 * auVar177._20_4_;
          auVar178._28_36_ = auVar177._28_36_;
          auVar178._24_4_ = fVar201 * auVar177._24_4_;
          auVar273 = ZEXT3264(auVar263);
          auVar112 = vfmadd213ps_fma(auVar149,auVar263,auVar178._0_32_);
          auVar264 = ZEXT3264(auVar258);
          auVar112 = vfmadd213ps_fma(auVar123,auVar258,ZEXT1632(auVar112));
          auVar124 = vandps_avx(ZEXT1632(auVar112),local_7c0);
          auVar151._8_4_ = 0x3e99999a;
          auVar151._0_8_ = 0x3e99999a3e99999a;
          auVar151._12_4_ = 0x3e99999a;
          auVar151._16_4_ = 0x3e99999a;
          auVar151._20_4_ = 0x3e99999a;
          auVar151._24_4_ = 0x3e99999a;
          auVar151._28_4_ = 0x3e99999a;
          auVar124 = vcmpps_avx(auVar124,auVar151,1);
          auVar124 = vorps_avx(auVar124,local_2a0);
          auVar152._8_4_ = 3;
          auVar152._0_8_ = 0x300000003;
          auVar152._12_4_ = 3;
          auVar152._16_4_ = 3;
          auVar152._20_4_ = 3;
          auVar152._24_4_ = 3;
          auVar152._28_4_ = 3;
          auVar173._8_4_ = 2;
          auVar173._0_8_ = 0x200000002;
          auVar173._12_4_ = 2;
          auVar173._16_4_ = 2;
          auVar173._20_4_ = 2;
          auVar173._24_4_ = 2;
          auVar173._28_4_ = 2;
          auVar124 = vblendvps_avx(auVar173,auVar152,auVar124);
          uVar100 = (undefined4)uVar101;
          local_2c0._4_4_ = uVar100;
          local_2c0._0_4_ = uVar100;
          local_2c0._8_4_ = uVar100;
          local_2c0._12_4_ = uVar100;
          local_2c0._16_4_ = uVar100;
          local_2c0._20_4_ = uVar100;
          local_2c0._24_4_ = uVar100;
          local_2c0._28_4_ = uVar100;
          local_5c0 = vpcmpgtd_avx2(auVar124,local_2c0);
          local_600 = vpandn_avx2(local_5c0,local_5a0);
          auVar177 = ZEXT3264(local_600);
          auVar124 = local_5a0 & ~local_5c0;
          local_660 = ZEXT1632(CONCAT88(auVar244._8_8_,uVar101));
          fVar212 = fVar201;
          fVar213 = fVar201;
          fVar215 = fVar201;
          fVar214 = fVar201;
          fVar235 = fVar201;
          fVar216 = fVar201;
          if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar124 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar124 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar124 >> 0x7f,0) != '\0') ||
                (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar124 >> 0xbf,0) != '\0') ||
              (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar124[0x1f] < '\0') {
            auVar244 = vminps_avx(local_a10,local_a30);
            auVar112 = vmaxps_avx(local_a10,local_a30);
            auVar256 = vminps_avx(local_a20,_local_a40);
            auVar139 = vminps_avx(auVar244,auVar256);
            auVar244 = vmaxps_avx(local_a20,_local_a40);
            auVar256 = vmaxps_avx(auVar112,auVar244);
            auVar182._8_4_ = 0x7fffffff;
            auVar182._0_8_ = 0x7fffffff7fffffff;
            auVar182._12_4_ = 0x7fffffff;
            auVar112 = vandps_avx(auVar139,auVar182);
            local_6e0._0_16_ = auVar182;
            auVar244 = vandps_avx(auVar256,auVar182);
            auVar112 = vmaxps_avx(auVar112,auVar244);
            auVar244 = vmovshdup_avx(auVar112);
            auVar244 = vmaxss_avx(auVar244,auVar112);
            auVar112 = vshufpd_avx(auVar112,auVar112,1);
            auVar112 = vmaxss_avx(auVar112,auVar244);
            local_820._0_4_ = auVar112._0_4_ * 1.9073486e-06;
            auVar112 = vshufps_avx(auVar256,auVar256,0xff);
            local_780 = ZEXT1632(auVar112);
            local_7a0._4_4_ = (float)local_8e0._4_4_ + (float)local_760._4_4_;
            local_7a0._0_4_ = (float)local_8e0._0_4_ + (float)local_760._0_4_;
            fStack_798 = fStack_8d8 + fStack_758;
            fStack_794 = fStack_8d4 + fStack_754;
            fStack_790 = fStack_8d0 + fStack_750;
            fStack_78c = fStack_8cc + fStack_74c;
            fStack_788 = fStack_8c8 + fStack_748;
            fStack_784 = fStack_8c4 + fStack_744;
            local_980 = auVar258;
            local_8a0 = auVar263;
            local_8c0._4_4_ = fVar201;
            local_8c0._0_4_ = fVar201;
            fStack_8b8 = fVar201;
            fStack_8b4 = fVar201;
            fStack_8b0 = fVar201;
            fStack_8ac = fVar201;
            fStack_8a8 = fVar201;
            fStack_8a4 = fVar201;
            _local_8e0 = auVar232;
            local_840 = auVar12;
            local_700 = auVar13;
            do {
              auVar153._8_4_ = 0x7f800000;
              auVar153._0_8_ = 0x7f8000007f800000;
              auVar153._12_4_ = 0x7f800000;
              auVar153._16_4_ = 0x7f800000;
              auVar153._20_4_ = 0x7f800000;
              auVar153._24_4_ = 0x7f800000;
              auVar153._28_4_ = 0x7f800000;
              auVar124 = auVar177._0_32_;
              auVar116 = vblendvps_avx(auVar153,_local_8e0,auVar124);
              auVar9 = vshufps_avx(auVar116,auVar116,0xb1);
              auVar9 = vminps_avx(auVar116,auVar9);
              auVar10 = vshufpd_avx(auVar9,auVar9,5);
              auVar9 = vminps_avx(auVar9,auVar10);
              auVar10 = vpermpd_avx2(auVar9,0x4e);
              auVar9 = vminps_avx(auVar9,auVar10);
              auVar116 = vcmpps_avx(auVar116,auVar9,0);
              auVar9 = auVar124 & auVar116;
              if ((((((((auVar9 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar9 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar9 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar9 >> 0x7f,0) != '\0') ||
                    (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar9 >> 0xbf,0) != '\0') ||
                  (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar9[0x1f] < '\0') {
                auVar124 = vandps_avx(auVar116,auVar124);
              }
              uVar96 = vmovmskps_avx(auVar124);
              iVar14 = 0;
              for (; (uVar96 & 1) == 0; uVar96 = uVar96 >> 1 | 0x80000000) {
                iVar14 = iVar14 + 1;
              }
              uVar96 = iVar14 << 2;
              *(undefined4 *)(local_600 + uVar96) = 0;
              aVar1 = (ray->super_RayK<1>).dir.field_0;
              local_900._0_16_ = (undefined1  [16])aVar1;
              auVar112 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
              auVar248 = ZEXT464(*(uint *)(local_500 + uVar96));
              if (auVar112._0_4_ < 0.0) {
                local_ae0._0_16_ = ZEXT416(*(uint *)(local_500 + uVar96));
                local_b00._0_16_ = ZEXT416((uint)*(float *)(local_4a0 + uVar96));
                fVar201 = sqrtf(auVar112._0_4_);
                auVar248 = ZEXT1664(local_ae0._0_16_);
                fVar265 = (float)local_b00._0_4_;
                uVar100 = local_b00._4_4_;
                uVar283 = local_b00._8_4_;
                uVar284 = local_b00._12_4_;
              }
              else {
                auVar112 = vsqrtss_avx(auVar112,auVar112);
                fVar201 = auVar112._0_4_;
                fVar265 = *(float *)(local_4a0 + uVar96);
                uVar100 = 0;
                uVar283 = 0;
                uVar284 = 0;
              }
              local_860._0_4_ = fVar201 * 1.9073486e-06;
              lVar102 = 4;
              do {
                auVar124 = local_b00;
                fVar212 = auVar248._0_4_;
                fVar235 = 1.0 - fVar212;
                local_a60._0_16_ = ZEXT416((uint)fVar235);
                fVar215 = fVar235 * fVar235 * fVar235;
                fVar214 = fVar212 * fVar212;
                fVar213 = fVar212 * fVar214;
                auVar244 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar215),
                                           ZEXT416((uint)fVar213));
                fVar201 = fVar212 * fVar235;
                auVar256 = vfmadd231ss_fma(ZEXT416((uint)(fVar212 * fVar201 * 6.0)),
                                           ZEXT416((uint)(fVar235 * fVar201)),
                                           SUB6416(ZEXT464(0x41400000),0));
                auVar139 = vfmadd231ss_fma(ZEXT416((uint)(fVar235 * fVar201 * 6.0)),
                                           SUB6416(ZEXT464(0x41400000),0),
                                           ZEXT416((uint)(fVar212 * fVar201)));
                auVar112 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar213),
                                           ZEXT416((uint)fVar215));
                fVar212 = (auVar112._0_4_ + auVar139._0_4_) * 0.16666667;
                fVar213 = fVar213 * 0.16666667;
                auVar137._0_4_ = fVar213 * (float)local_a40._0_4_;
                auVar137._4_4_ = fVar213 * (float)local_a40._4_4_;
                auVar137._8_4_ = fVar213 * fStack_a38;
                auVar137._12_4_ = fVar213 * fStack_a34;
                auVar183._4_4_ = fVar212;
                auVar183._0_4_ = fVar212;
                auVar183._8_4_ = fVar212;
                auVar183._12_4_ = fVar212;
                auVar112 = vfmadd132ps_fma(auVar183,auVar137,local_a20);
                fVar212 = (auVar244._0_4_ + auVar256._0_4_) * 0.16666667;
                auVar138._4_4_ = fVar212;
                auVar138._0_4_ = fVar212;
                auVar138._8_4_ = fVar212;
                auVar138._12_4_ = fVar212;
                auVar112 = vfmadd132ps_fma(auVar138,auVar112,local_a30);
                auVar162._4_4_ = fVar265;
                auVar162._0_4_ = fVar265;
                auVar162._8_4_ = fVar265;
                auVar162._12_4_ = fVar265;
                auVar244 = vfmadd213ps_fma(auVar162,local_900._0_16_,_DAT_01feba10);
                fVar215 = fVar215 * 0.16666667;
                auVar107._4_4_ = fVar215;
                auVar107._0_4_ = fVar215;
                auVar107._8_4_ = fVar215;
                auVar107._12_4_ = fVar215;
                auVar112 = vfmadd132ps_fma(auVar107,auVar112,local_a10);
                local_6c0._0_16_ = auVar112;
                auVar112 = vsubps_avx(auVar244,auVar112);
                _local_960 = auVar112;
                auVar112 = vdpps_avx(auVar112,auVar112,0x7f);
                local_ae0._0_16_ = auVar248._0_16_;
                local_b00._4_4_ = uVar100;
                local_b00._0_4_ = fVar265;
                local_b00._8_4_ = uVar283;
                local_b00._16_16_ = auVar124._16_16_;
                local_b00._12_4_ = uVar284;
                local_ac0._0_16_ = auVar112;
                if (auVar112._0_4_ < 0.0) {
                  local_a60._0_16_ = ZEXT416((uint)fVar235);
                  local_9e0._0_4_ = fVar214;
                  local_920._0_4_ = fVar201;
                  auVar225._0_4_ = sqrtf(auVar112._0_4_);
                  auVar225._4_60_ = extraout_var;
                  auVar112 = auVar225._0_16_;
                  fVar214 = (float)local_9e0._0_4_;
                  fVar201 = (float)local_920._0_4_;
                  auVar244 = local_ae0._0_16_;
                  fVar265 = (float)local_b00._0_4_;
                }
                else {
                  auVar112 = vsqrtss_avx(auVar112,auVar112);
                  auVar244 = auVar248._0_16_;
                }
                fVar212 = local_a60._0_4_;
                auVar108._4_4_ = fVar212;
                auVar108._0_4_ = fVar212;
                auVar108._8_4_ = fVar212;
                auVar108._12_4_ = fVar212;
                auVar139 = vfnmsub213ss_fma(auVar244,auVar244,ZEXT416((uint)(fVar201 * 4.0)));
                auVar256 = vfmadd231ss_fma(ZEXT416((uint)(fVar201 * 4.0)),local_a60._0_16_,
                                           local_a60._0_16_);
                fVar201 = fVar212 * -fVar212 * 0.5;
                fVar212 = auVar139._0_4_ * 0.5;
                fVar213 = auVar256._0_4_ * 0.5;
                fVar214 = fVar214 * 0.5;
                auVar219._0_4_ = (float)local_a40._0_4_ * fVar214;
                auVar219._4_4_ = (float)local_a40._4_4_ * fVar214;
                auVar219._8_4_ = fStack_a38 * fVar214;
                auVar219._12_4_ = fStack_a34 * fVar214;
                auVar184._4_4_ = fVar213;
                auVar184._0_4_ = fVar213;
                auVar184._8_4_ = fVar213;
                auVar184._12_4_ = fVar213;
                auVar256 = vfmadd213ps_fma(auVar184,local_a20,auVar219);
                auVar202._4_4_ = fVar212;
                auVar202._0_4_ = fVar212;
                auVar202._8_4_ = fVar212;
                auVar202._12_4_ = fVar212;
                auVar256 = vfmadd213ps_fma(auVar202,local_a30,auVar256);
                auVar255._4_4_ = fVar201;
                auVar255._0_4_ = fVar201;
                auVar255._8_4_ = fVar201;
                auVar255._12_4_ = fVar201;
                auVar3 = vfmadd213ps_fma(auVar255,local_a10,auVar256);
                auVar256 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_a60._0_16_,auVar244)
                ;
                auVar139 = vfmadd231ss_fma(local_a60._0_16_,auVar244,SUB6416(ZEXT464(0xc0000000),0))
                ;
                fVar201 = auVar244._0_4_;
                auVar185._0_4_ = (float)local_a40._0_4_ * fVar201;
                auVar185._4_4_ = (float)local_a40._4_4_ * fVar201;
                auVar185._8_4_ = fStack_a38 * fVar201;
                auVar185._12_4_ = fStack_a34 * fVar201;
                uVar100 = auVar139._0_4_;
                auVar203._4_4_ = uVar100;
                auVar203._0_4_ = uVar100;
                auVar203._8_4_ = uVar100;
                auVar203._12_4_ = uVar100;
                auVar244 = vfmadd213ps_fma(auVar203,local_a20,auVar185);
                auVar163._0_4_ = auVar256._0_4_;
                auVar163._4_4_ = auVar163._0_4_;
                auVar163._8_4_ = auVar163._0_4_;
                auVar163._12_4_ = auVar163._0_4_;
                auVar244 = vfmadd213ps_fma(auVar163,local_a30,auVar244);
                auVar165 = vfmadd231ps_fma(auVar244,local_a10,auVar108);
                auVar256 = vdpps_avx(auVar3,auVar3,0x7f);
                auVar244 = vblendps_avx(auVar256,_DAT_01feba10,0xe);
                auVar139 = vrsqrtss_avx(auVar244,auVar244);
                fVar201 = auVar139._0_4_;
                fVar213 = auVar256._0_4_;
                fVar201 = fVar201 * 1.5 + fVar213 * -0.5 * fVar201 * fVar201 * fVar201;
                auVar139 = vdpps_avx(auVar3,auVar165,0x7f);
                auVar164._0_4_ = auVar165._0_4_ * fVar213;
                auVar164._4_4_ = auVar165._4_4_ * fVar213;
                auVar164._8_4_ = auVar165._8_4_ * fVar213;
                auVar164._12_4_ = auVar165._12_4_ * fVar213;
                fVar212 = auVar139._0_4_;
                auVar220._0_4_ = auVar3._0_4_ * fVar212;
                auVar220._4_4_ = auVar3._4_4_ * fVar212;
                fVar215 = auVar3._8_4_;
                auVar220._8_4_ = fVar215 * fVar212;
                fVar214 = auVar3._12_4_;
                auVar220._12_4_ = fVar214 * fVar212;
                auVar139 = vsubps_avx(auVar164,auVar220);
                auVar244 = vrcpss_avx(auVar244,auVar244);
                auVar165 = vfnmadd213ss_fma(auVar244,auVar256,ZEXT416(0x40000000));
                fVar212 = auVar244._0_4_ * auVar165._0_4_;
                auVar244 = vmaxss_avx(ZEXT416((uint)local_820._0_4_),
                                      ZEXT416((uint)(fVar265 * (float)local_860._0_4_)));
                auVar294 = ZEXT1664(auVar244);
                auVar245._0_8_ = auVar3._0_8_ ^ 0x8000000080000000;
                auVar245._8_4_ = -fVar215;
                auVar245._12_4_ = -fVar214;
                local_940._0_4_ = fVar201 * auVar139._0_4_ * fVar212;
                local_940._4_4_ = fVar201 * auVar139._4_4_ * fVar212;
                local_940._8_4_ = fVar201 * auVar139._8_4_ * fVar212;
                local_940._12_4_ = fVar201 * auVar139._12_4_ * fVar212;
                local_a00._0_4_ = auVar3._0_4_ * fVar201;
                local_a00._4_4_ = auVar3._4_4_ * fVar201;
                local_a00._8_4_ = fVar215 * fVar201;
                local_a00._12_4_ = fVar214 * fVar201;
                local_a60._0_16_ = auVar3;
                local_9e0._0_4_ = auVar244._0_4_;
                if (fVar213 < -fVar213) {
                  local_920._0_4_ = auVar112._0_4_;
                  local_840._0_16_ = auVar245;
                  fVar201 = sqrtf(fVar213);
                  auVar294 = ZEXT464((uint)local_9e0._0_4_);
                  auVar112 = ZEXT416((uint)local_920._0_4_);
                  auVar245 = local_840._0_16_;
                }
                else {
                  auVar244 = vsqrtss_avx(auVar256,auVar256);
                  fVar201 = auVar244._0_4_;
                }
                local_920._0_16_ = vdpps_avx(_local_960,local_a00._0_16_,0x7f);
                auVar3 = vfmadd213ss_fma(ZEXT416((uint)local_820._0_4_),auVar112,auVar294._0_16_);
                auVar244 = vdpps_avx(auVar245,local_a00._0_16_,0x7f);
                auVar256 = vdpps_avx(_local_960,local_940._0_16_,0x7f);
                auVar139 = vdpps_avx(local_900._0_16_,local_a00._0_16_,0x7f);
                auVar112 = vfmadd213ss_fma(ZEXT416((uint)(auVar112._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_820._0_4_ / fVar201)),auVar3)
                ;
                local_840._0_4_ = auVar112._0_4_;
                auVar109._0_4_ = local_920._0_4_ * local_920._0_4_;
                auVar109._4_4_ = local_920._4_4_ * local_920._4_4_;
                auVar109._8_4_ = local_920._8_4_ * local_920._8_4_;
                auVar109._12_4_ = local_920._12_4_ * local_920._12_4_;
                auVar112 = vdpps_avx(_local_960,auVar245,0x7f);
                auVar165 = vsubps_avx(local_ac0._0_16_,auVar109);
                auVar3 = vrsqrtss_avx(auVar165,auVar165);
                fVar212 = auVar165._0_4_;
                fVar201 = auVar3._0_4_;
                fVar201 = fVar201 * 1.5 + fVar212 * -0.5 * fVar201 * fVar201 * fVar201;
                auVar3 = vdpps_avx(_local_960,local_900._0_16_,0x7f);
                local_a00._0_16_ = ZEXT416((uint)(auVar244._0_4_ + auVar256._0_4_));
                local_940._0_16_ = vfnmadd231ss_fma(auVar112,local_920._0_16_,local_a00._0_16_);
                auVar15 = vfnmadd231ss_fma(auVar3,local_920._0_16_,auVar139);
                if (fVar212 < 0.0) {
                  local_700._0_16_ = auVar139;
                  local_720._0_4_ = fVar201;
                  local_740 = auVar15._0_4_;
                  fStack_73c = auVar15._4_4_;
                  fStack_738 = auVar15._8_4_;
                  fStack_734 = auVar15._12_4_;
                  fVar212 = sqrtf(fVar212);
                  auVar15._4_4_ = fStack_73c;
                  auVar15._0_4_ = local_740;
                  auVar15._8_4_ = fStack_738;
                  auVar15._12_4_ = fStack_734;
                  auVar294 = ZEXT464((uint)local_9e0._0_4_);
                  fVar201 = (float)local_720._0_4_;
                  auVar139 = local_700._0_16_;
                }
                else {
                  auVar112 = vsqrtss_avx(auVar165,auVar165);
                  fVar212 = auVar112._0_4_;
                }
                auVar264 = ZEXT3264(local_980);
                auVar273 = ZEXT3264(local_8a0);
                auVar244 = vpermilps_avx(local_6c0._0_16_,0xff);
                auVar3 = vshufps_avx(local_a60._0_16_,local_a60._0_16_,0xff);
                auVar112 = vfmsub213ss_fma(local_940._0_16_,ZEXT416((uint)fVar201),auVar3);
                auVar186._0_8_ = auVar139._0_8_ ^ 0x8000000080000000;
                auVar186._8_4_ = auVar139._8_4_ ^ 0x80000000;
                auVar186._12_4_ = auVar139._12_4_ ^ 0x80000000;
                auVar204._0_8_ = auVar112._0_8_ ^ 0x8000000080000000;
                auVar204._8_4_ = auVar112._8_4_ ^ 0x80000000;
                auVar204._12_4_ = auVar112._12_4_ ^ 0x80000000;
                auVar234 = ZEXT1664(local_a00._0_16_);
                auVar165 = ZEXT416((uint)(auVar15._0_4_ * fVar201));
                auVar256 = vfmsub231ss_fma(ZEXT416((uint)(auVar139._0_4_ * auVar112._0_4_)),
                                           local_a00._0_16_,auVar165);
                auVar112 = vinsertps_avx(auVar165,auVar186,0x10);
                uVar100 = auVar256._0_4_;
                auVar187._4_4_ = uVar100;
                auVar187._0_4_ = uVar100;
                auVar187._8_4_ = uVar100;
                auVar187._12_4_ = uVar100;
                auVar112 = vdivps_avx(auVar112,auVar187);
                auVar259 = ZEXT1664(local_920._0_16_);
                auVar139 = ZEXT416((uint)(fVar212 - auVar244._0_4_));
                auVar256 = vinsertps_avx(local_920._0_16_,auVar139,0x10);
                auVar225 = ZEXT1664(auVar256);
                auVar166._0_4_ = auVar256._0_4_ * auVar112._0_4_;
                auVar166._4_4_ = auVar256._4_4_ * auVar112._4_4_;
                auVar166._8_4_ = auVar256._8_4_ * auVar112._8_4_;
                auVar166._12_4_ = auVar256._12_4_ * auVar112._12_4_;
                auVar112 = vinsertps_avx(auVar204,local_a00._0_16_,0x1c);
                auVar112 = vdivps_avx(auVar112,auVar187);
                auVar188._0_4_ = auVar256._0_4_ * auVar112._0_4_;
                auVar188._4_4_ = auVar256._4_4_ * auVar112._4_4_;
                auVar188._8_4_ = auVar256._8_4_ * auVar112._8_4_;
                auVar188._12_4_ = auVar256._12_4_ * auVar112._12_4_;
                auVar112 = vhaddps_avx(auVar166,auVar166);
                auVar244 = vhaddps_avx(auVar188,auVar188);
                fVar274 = (float)local_ae0._0_4_ - auVar112._0_4_;
                auVar248 = ZEXT464((uint)fVar274);
                fVar265 = (float)local_b00._0_4_ - auVar244._0_4_;
                uVar100 = 0;
                uVar283 = 0;
                uVar284 = 0;
                auVar112 = vandps_avx(local_920._0_16_,local_6e0._0_16_);
                fVar212 = (float)local_8c0._4_4_;
                fVar213 = fStack_8b8;
                fVar215 = fStack_8b4;
                fVar214 = fStack_8b0;
                fVar235 = fStack_8ac;
                fVar216 = fStack_8a8;
                fVar201 = (float)local_8c0._0_4_;
                if ((float)local_840._0_4_ <= auVar112._0_4_) {
LAB_0183cda2:
                  bVar65 = false;
                }
                else {
                  auVar244 = vfmadd231ss_fma(ZEXT416((uint)(auVar294._0_4_ + (float)local_840._0_4_)
                                                    ),local_780._0_16_,ZEXT416(0x36000000));
                  auVar112 = vandps_avx(auVar139,local_6e0._0_16_);
                  if (auVar244._0_4_ <= auVar112._0_4_) goto LAB_0183cda2;
                  fVar265 = fVar265 + (float)local_7f0._0_4_;
                  uVar100 = 0;
                  uVar283 = 0;
                  uVar284 = 0;
                  bVar65 = true;
                  if (((((ray->super_RayK<1>).org.field_0.m128[3] <= fVar265) &&
                       (fVar275 = (ray->super_RayK<1>).tfar, fVar265 <= fVar275)) &&
                      (0.0 <= fVar274)) && (fVar274 <= 1.0)) {
                    auVar112 = vrsqrtss_avx(local_ac0._0_16_,local_ac0._0_16_);
                    fVar276 = auVar112._0_4_;
                    pGVar7 = (context->scene->geometries).items[local_b08].ptr;
                    if ((pGVar7->mask & (ray->super_RayK<1>).mask) != 0) {
                      fVar276 = fVar276 * 1.5 + local_ac0._0_4_ * -0.5 * fVar276 * fVar276 * fVar276
                      ;
                      auVar140._0_4_ = fVar276 * (float)local_960._0_4_;
                      auVar140._4_4_ = fVar276 * (float)local_960._4_4_;
                      auVar140._8_4_ = fVar276 * fStack_958;
                      auVar140._12_4_ = fVar276 * fStack_954;
                      auVar3 = vfmadd213ps_fma(auVar3,auVar140,local_a60._0_16_);
                      auVar112 = vshufps_avx(auVar140,auVar140,0xc9);
                      auVar244 = vshufps_avx(local_a60._0_16_,local_a60._0_16_,0xc9);
                      auVar141._0_4_ = auVar140._0_4_ * auVar244._0_4_;
                      auVar141._4_4_ = auVar140._4_4_ * auVar244._4_4_;
                      auVar141._8_4_ = auVar140._8_4_ * auVar244._8_4_;
                      auVar141._12_4_ = auVar140._12_4_ * auVar244._12_4_;
                      auVar139 = vfmsub231ps_fma(auVar141,local_a60._0_16_,auVar112);
                      auVar112 = vshufps_avx(auVar139,auVar139,0xc9);
                      auVar244 = vshufps_avx(auVar3,auVar3,0xc9);
                      auVar139 = vshufps_avx(auVar139,auVar139,0xd2);
                      auVar110._0_4_ = auVar3._0_4_ * auVar139._0_4_;
                      auVar110._4_4_ = auVar3._4_4_ * auVar139._4_4_;
                      auVar110._8_4_ = auVar3._8_4_ * auVar139._8_4_;
                      auVar110._12_4_ = auVar3._12_4_ * auVar139._12_4_;
                      auVar112 = vfmsub231ps_fma(auVar110,auVar112,auVar244);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        (ray->super_RayK<1>).tfar = fVar265;
                        auVar244 = vshufps_avx(auVar112,auVar112,0xe9);
                        uVar227 = vmovlps_avx(auVar244);
                        *(undefined8 *)&(ray->Ng).field_0 = uVar227;
                        (ray->Ng).field_0.field_0.z = auVar112._0_4_;
                        ray->u = fVar274;
                        ray->v = 0.0;
                        ray->primID = uVar98;
                        ray->geomID = (uint)local_b08;
                        ray->instID[0] = context->user->instID[0];
                        ray->instPrimID[0] = context->user->instPrimID[0];
                      }
                      else {
                        auVar244 = vshufps_avx(auVar112,auVar112,0xe9);
                        local_9b0 = vmovlps_avx(auVar244);
                        local_9a8 = auVar112._0_4_;
                        local_9a4 = fVar274;
                        local_9a0 = 0;
                        local_99c = uVar98;
                        local_998 = (uint)local_b08;
                        local_994 = context->user->instID[0];
                        local_990 = context->user->instPrimID[0];
                        (ray->super_RayK<1>).tfar = fVar265;
                        local_b0c = -1;
                        local_a90.valid = &local_b0c;
                        local_a90.geometryUserPtr = pGVar7->userPtr;
                        local_a90.context = context->user;
                        local_a90.ray = (RTCRayN *)ray;
                        local_a90.hit = (RTCHitN *)&local_9b0;
                        local_a90.N = 1;
                        local_ae0._0_16_ = ZEXT416((uint)fVar274);
                        local_b00._0_16_ = ZEXT416((uint)fVar265);
                        local_ac0._0_4_ = fVar275;
                        if (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0183cee1:
                          p_Var8 = context->args->filter;
                          fVar201 = (float)local_8c0._0_4_;
                          fVar212 = (float)local_8c0._4_4_;
                          fVar213 = fStack_8b8;
                          fVar215 = fStack_8b4;
                          fVar214 = fStack_8b0;
                          fVar235 = fStack_8ac;
                          fVar216 = fStack_8a8;
                          if (p_Var8 != (RTCFilterFunctionN)0x0) {
                            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar7->field_8).field_0x2 & 0x40) != 0)) {
                              auVar225 = ZEXT1664(auVar225._0_16_);
                              auVar234 = ZEXT1664(auVar234._0_16_);
                              auVar259 = ZEXT1664(auVar259._0_16_);
                              auVar294 = ZEXT1664(auVar294._0_16_);
                              (*p_Var8)(&local_a90);
                              auVar248 = ZEXT1664(local_ae0._0_16_);
                              auVar273 = ZEXT3264(local_8a0);
                              auVar264 = ZEXT3264(local_980);
                              fVar275 = (float)local_ac0._0_4_;
                              fVar265 = (float)local_b00._0_4_;
                              uVar100 = local_b00._4_4_;
                              uVar283 = local_b00._8_4_;
                              uVar284 = local_b00._12_4_;
                              fVar201 = (float)local_8c0._0_4_;
                              fVar212 = (float)local_8c0._4_4_;
                              fVar213 = fStack_8b8;
                              fVar215 = fStack_8b4;
                              fVar214 = fStack_8b0;
                              fVar235 = fStack_8ac;
                              fVar216 = fStack_8a8;
                            }
                            if (*local_a90.valid == 0) goto LAB_0183cfa0;
                          }
                          (((Vec3f *)((long)local_a90.ray + 0x30))->field_0).components[0] =
                               *(float *)local_a90.hit;
                          (((Vec3f *)((long)local_a90.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_a90.hit + 4);
                          (((Vec3f *)((long)local_a90.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_a90.hit + 8);
                          *(float *)((long)local_a90.ray + 0x3c) = *(float *)(local_a90.hit + 0xc);
                          *(float *)((long)local_a90.ray + 0x40) = *(float *)(local_a90.hit + 0x10);
                          *(float *)((long)local_a90.ray + 0x44) = *(float *)(local_a90.hit + 0x14);
                          *(float *)((long)local_a90.ray + 0x48) = *(float *)(local_a90.hit + 0x18);
                          *(float *)((long)local_a90.ray + 0x4c) = *(float *)(local_a90.hit + 0x1c);
                          *(float *)((long)local_a90.ray + 0x50) = *(float *)(local_a90.hit + 0x20);
                        }
                        else {
                          auVar225 = ZEXT1664(auVar256);
                          auVar234 = ZEXT1664(local_a00._0_16_);
                          auVar259 = ZEXT1664(local_920._0_16_);
                          auVar294 = ZEXT1664(auVar294._0_16_);
                          (*pGVar7->intersectionFilterN)(&local_a90);
                          auVar248 = ZEXT1664(local_ae0._0_16_);
                          auVar273 = ZEXT3264(local_8a0);
                          auVar264 = ZEXT3264(local_980);
                          fVar275 = (float)local_ac0._0_4_;
                          fVar265 = (float)local_b00._0_4_;
                          uVar100 = local_b00._4_4_;
                          uVar283 = local_b00._8_4_;
                          uVar284 = local_b00._12_4_;
                          fVar201 = (float)local_8c0._0_4_;
                          fVar212 = (float)local_8c0._4_4_;
                          fVar213 = fStack_8b8;
                          fVar215 = fStack_8b4;
                          fVar214 = fStack_8b0;
                          fVar235 = fStack_8ac;
                          fVar216 = fStack_8a8;
                          if (*local_a90.valid != 0) goto LAB_0183cee1;
LAB_0183cfa0:
                          (ray->super_RayK<1>).tfar = fVar275;
                        }
                      }
                    }
                  }
                }
                auVar124 = local_600;
                bVar103 = lVar102 != 0;
                lVar102 = lVar102 + -1;
              } while ((!bVar65) && (bVar103));
              fVar265 = (ray->super_RayK<1>).tfar;
              auVar125._4_4_ = fVar265;
              auVar125._0_4_ = fVar265;
              auVar125._8_4_ = fVar265;
              auVar125._12_4_ = fVar265;
              auVar125._16_4_ = fVar265;
              auVar125._20_4_ = fVar265;
              auVar125._24_4_ = fVar265;
              auVar125._28_4_ = fVar265;
              auVar116 = vcmpps_avx(_local_7a0,auVar125,2);
              local_600 = vandps_avx(auVar116,local_600);
              auVar177 = ZEXT3264(local_600);
              auVar124 = auVar124 & auVar116;
              uVar101 = local_660._0_8_;
            } while ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar124 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar124 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar124 >> 0x7f,0) != '\0') ||
                       (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar124 >> 0xbf,0) != '\0') ||
                     (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar124[0x1f] < '\0');
          }
          auVar130._0_4_ = fVar201 * (float)local_880._0_4_;
          auVar130._4_4_ = fVar212 * (float)local_880._4_4_;
          auVar130._8_4_ = fVar213 * fStack_878;
          auVar130._12_4_ = fVar215 * fStack_874;
          auVar130._16_4_ = fVar214 * fStack_870;
          auVar130._20_4_ = fVar235 * fStack_86c;
          auVar130._28_36_ = auVar177._28_36_;
          auVar130._24_4_ = fVar216 * fStack_868;
          auVar112 = vfmadd213ps_fma(local_6a0,auVar273._0_32_,auVar130._0_32_);
          auVar112 = vfmadd213ps_fma(local_680,auVar264._0_32_,ZEXT1632(auVar112));
          auVar124 = vandps_avx(ZEXT1632(auVar112),local_7c0);
          auVar154._8_4_ = 0x3e99999a;
          auVar154._0_8_ = 0x3e99999a3e99999a;
          auVar154._12_4_ = 0x3e99999a;
          auVar154._16_4_ = 0x3e99999a;
          auVar154._20_4_ = 0x3e99999a;
          auVar154._24_4_ = 0x3e99999a;
          auVar154._28_4_ = 0x3e99999a;
          auVar124 = vcmpps_avx(auVar124,auVar154,1);
          auVar116 = vorps_avx(auVar124,local_2a0);
          auVar155._0_4_ = (float)local_5e0._0_4_ + (float)local_760._0_4_;
          auVar155._4_4_ = (float)local_5e0._4_4_ + (float)local_760._4_4_;
          auVar155._8_4_ = fStack_5d8 + fStack_758;
          auVar155._12_4_ = fStack_5d4 + fStack_754;
          auVar155._16_4_ = fStack_5d0 + fStack_750;
          auVar155._20_4_ = fStack_5cc + fStack_74c;
          auVar155._24_4_ = fStack_5c8 + fStack_748;
          auVar155._28_4_ = fStack_5c4 + fStack_744;
          fVar201 = (ray->super_RayK<1>).tfar;
          auVar174._4_4_ = fVar201;
          auVar174._0_4_ = fVar201;
          auVar174._8_4_ = fVar201;
          auVar174._12_4_ = fVar201;
          auVar174._16_4_ = fVar201;
          auVar174._20_4_ = fVar201;
          auVar174._24_4_ = fVar201;
          auVar174._28_4_ = fVar201;
          auVar124 = vcmpps_avx(auVar155,auVar174,2);
          local_780 = vandps_avx(auVar124,local_280);
          auVar156._8_4_ = 3;
          auVar156._0_8_ = 0x300000003;
          auVar156._12_4_ = 3;
          auVar156._16_4_ = 3;
          auVar156._20_4_ = 3;
          auVar156._24_4_ = 3;
          auVar156._28_4_ = 3;
          auVar175._8_4_ = 2;
          auVar175._0_8_ = 0x200000002;
          auVar175._12_4_ = 2;
          auVar175._16_4_ = 2;
          auVar175._20_4_ = 2;
          auVar175._24_4_ = 2;
          auVar175._28_4_ = 2;
          auVar124 = vblendvps_avx(auVar175,auVar156,auVar116);
          _local_7a0 = vpcmpgtd_avx2(auVar124,local_2c0);
          local_620 = vpandn_avx2(_local_7a0,local_780);
          auVar124 = local_780 & ~_local_7a0;
          if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar124 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar124 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar124 >> 0x7f,0) != '\0') ||
                (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar124 >> 0xbf,0) != '\0') ||
              (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar124[0x1f] < '\0') {
            auVar244 = vminps_avx(local_a10,local_a30);
            auVar112 = vmaxps_avx(local_a10,local_a30);
            auVar256 = vminps_avx(local_a20,_local_a40);
            auVar139 = vminps_avx(auVar244,auVar256);
            auVar244 = vmaxps_avx(local_a20,_local_a40);
            auVar256 = vmaxps_avx(auVar112,auVar244);
            local_840._8_4_ = 0x7fffffff;
            local_840._0_8_ = 0x7fffffff7fffffff;
            local_840._12_4_ = 0x7fffffff;
            auVar112 = vandps_avx(auVar139,local_840._0_16_);
            auVar244 = vandps_avx(auVar256,local_840._0_16_);
            auVar112 = vmaxps_avx(auVar112,auVar244);
            auVar244 = vmovshdup_avx(auVar112);
            auVar244 = vmaxss_avx(auVar244,auVar112);
            auVar112 = vshufpd_avx(auVar112,auVar112,1);
            auVar112 = vmaxss_avx(auVar112,auVar244);
            local_820._0_4_ = auVar112._0_4_ * 1.9073486e-06;
            local_700._0_16_ = vshufps_avx(auVar256,auVar256,0xff);
            local_720 = _local_4e0;
            local_740 = (float)local_4e0._0_4_ + (float)local_760._0_4_;
            fStack_73c = (float)local_4e0._4_4_ + (float)local_760._4_4_;
            fStack_738 = fStack_4d8 + fStack_758;
            fStack_734 = fStack_4d4 + fStack_754;
            fStack_730 = fStack_4d0 + fStack_750;
            fStack_72c = fStack_4cc + fStack_74c;
            fStack_728 = fStack_4c8 + fStack_748;
            fStack_724 = fStack_4c4 + fStack_744;
            do {
              auVar157._8_4_ = 0x7f800000;
              auVar157._0_8_ = 0x7f8000007f800000;
              auVar157._12_4_ = 0x7f800000;
              auVar157._16_4_ = 0x7f800000;
              auVar157._20_4_ = 0x7f800000;
              auVar157._24_4_ = 0x7f800000;
              auVar157._28_4_ = 0x7f800000;
              auVar124 = vblendvps_avx(auVar157,local_720,local_620);
              auVar116 = vshufps_avx(auVar124,auVar124,0xb1);
              auVar116 = vminps_avx(auVar124,auVar116);
              auVar9 = vshufpd_avx(auVar116,auVar116,5);
              auVar116 = vminps_avx(auVar116,auVar9);
              auVar9 = vpermpd_avx2(auVar116,0x4e);
              auVar116 = vminps_avx(auVar116,auVar9);
              auVar116 = vcmpps_avx(auVar124,auVar116,0);
              auVar9 = local_620 & auVar116;
              auVar124 = local_620;
              if ((((((((auVar9 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar9 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar9 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar9 >> 0x7f,0) != '\0') ||
                    (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar9 >> 0xbf,0) != '\0') ||
                  (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar9[0x1f] < '\0') {
                auVar124 = vandps_avx(auVar116,local_620);
              }
              uVar96 = vmovmskps_avx(auVar124);
              iVar14 = 0;
              for (; (uVar96 & 1) == 0; uVar96 = uVar96 >> 1 | 0x80000000) {
                iVar14 = iVar14 + 1;
              }
              uVar96 = iVar14 << 2;
              *(undefined4 *)(local_620 + uVar96) = 0;
              aVar1 = (ray->super_RayK<1>).dir.field_0;
              local_900._0_16_ = (undefined1  [16])aVar1;
              auVar112 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
              auVar248 = ZEXT464(*(uint *)(local_520 + uVar96));
              auVar259 = ZEXT464(*(uint *)(local_4c0 + uVar96));
              if (auVar112._0_4_ < 0.0) {
                local_ae0._0_16_ = ZEXT416(*(uint *)(local_520 + uVar96));
                local_b00._0_16_ = ZEXT416(*(uint *)(local_4c0 + uVar96));
                fVar201 = sqrtf(auVar112._0_4_);
                auVar259 = ZEXT1664(local_b00._0_16_);
                auVar248 = ZEXT1664(local_ae0._0_16_);
              }
              else {
                auVar112 = vsqrtss_avx(auVar112,auVar112);
                fVar201 = auVar112._0_4_;
              }
              local_920._0_4_ = fVar201 * 1.9073486e-06;
              lVar102 = 4;
              do {
                fVar212 = auVar248._0_4_;
                fVar235 = 1.0 - fVar212;
                local_a60._0_16_ = ZEXT416((uint)fVar235);
                fVar215 = fVar235 * fVar235 * fVar235;
                fVar214 = fVar212 * fVar212;
                fVar213 = fVar212 * fVar214;
                auVar244 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar215),
                                           ZEXT416((uint)fVar213));
                fVar201 = fVar212 * fVar235;
                auVar256 = vfmadd231ss_fma(ZEXT416((uint)(fVar212 * fVar201 * 6.0)),
                                           ZEXT416((uint)(fVar235 * fVar201)),
                                           SUB6416(ZEXT464(0x41400000),0));
                auVar139 = vfmadd231ss_fma(ZEXT416((uint)(fVar235 * fVar201 * 6.0)),
                                           SUB6416(ZEXT464(0x41400000),0),
                                           ZEXT416((uint)(fVar212 * fVar201)));
                auVar112 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar213),
                                           ZEXT416((uint)fVar215));
                fVar212 = (auVar112._0_4_ + auVar139._0_4_) * 0.16666667;
                fVar213 = fVar213 * 0.16666667;
                auVar142._0_4_ = fVar213 * (float)local_a40._0_4_;
                auVar142._4_4_ = fVar213 * (float)local_a40._4_4_;
                auVar142._8_4_ = fVar213 * fStack_a38;
                auVar142._12_4_ = fVar213 * fStack_a34;
                auVar189._4_4_ = fVar212;
                auVar189._0_4_ = fVar212;
                auVar189._8_4_ = fVar212;
                auVar189._12_4_ = fVar212;
                auVar112 = vfmadd132ps_fma(auVar189,auVar142,local_a20);
                fVar212 = (auVar244._0_4_ + auVar256._0_4_) * 0.16666667;
                auVar143._4_4_ = fVar212;
                auVar143._0_4_ = fVar212;
                auVar143._8_4_ = fVar212;
                auVar143._12_4_ = fVar212;
                auVar112 = vfmadd132ps_fma(auVar143,auVar112,local_a30);
                uVar100 = auVar259._0_4_;
                auVar167._4_4_ = uVar100;
                auVar167._0_4_ = uVar100;
                auVar167._8_4_ = uVar100;
                auVar167._12_4_ = uVar100;
                auVar244 = vfmadd213ps_fma(auVar167,local_900._0_16_,_DAT_01feba10);
                fVar215 = fVar215 * 0.16666667;
                auVar111._4_4_ = fVar215;
                auVar111._0_4_ = fVar215;
                auVar111._8_4_ = fVar215;
                auVar111._12_4_ = fVar215;
                auVar112 = vfmadd132ps_fma(auVar111,auVar112,local_a10);
                local_6c0._0_16_ = auVar112;
                auVar112 = vsubps_avx(auVar244,auVar112);
                _local_960 = auVar112;
                auVar112 = vdpps_avx(auVar112,auVar112,0x7f);
                local_ae0._0_16_ = auVar248._0_16_;
                local_b00._0_16_ = auVar259._0_16_;
                local_ac0._0_16_ = auVar112;
                if (auVar112._0_4_ < 0.0) {
                  local_a60._0_16_ = ZEXT416((uint)fVar235);
                  local_9e0._0_4_ = fVar214;
                  local_a00._0_4_ = fVar201;
                  auVar234._0_4_ = sqrtf(auVar112._0_4_);
                  auVar234._4_60_ = extraout_var_00;
                  auVar112 = auVar234._0_16_;
                  fVar201 = (float)local_a00._0_4_;
                  fVar214 = (float)local_9e0._0_4_;
                  auVar244 = local_ae0._0_16_;
                  auVar256 = local_b00._0_16_;
                }
                else {
                  auVar112 = vsqrtss_avx(auVar112,auVar112);
                  auVar244 = auVar248._0_16_;
                  auVar256 = auVar259._0_16_;
                }
                fVar212 = local_a60._0_4_;
                auVar113._4_4_ = fVar212;
                auVar113._0_4_ = fVar212;
                auVar113._8_4_ = fVar212;
                auVar113._12_4_ = fVar212;
                auVar3 = vfnmsub213ss_fma(auVar244,auVar244,ZEXT416((uint)(fVar201 * 4.0)));
                auVar139 = vfmadd231ss_fma(ZEXT416((uint)(fVar201 * 4.0)),local_a60._0_16_,
                                           local_a60._0_16_);
                fVar201 = fVar212 * -fVar212 * 0.5;
                fVar212 = auVar3._0_4_ * 0.5;
                fVar213 = auVar139._0_4_ * 0.5;
                fVar214 = fVar214 * 0.5;
                auVar221._0_4_ = (float)local_a40._0_4_ * fVar214;
                auVar221._4_4_ = (float)local_a40._4_4_ * fVar214;
                auVar221._8_4_ = fStack_a38 * fVar214;
                auVar221._12_4_ = fStack_a34 * fVar214;
                auVar190._4_4_ = fVar213;
                auVar190._0_4_ = fVar213;
                auVar190._8_4_ = fVar213;
                auVar190._12_4_ = fVar213;
                auVar139 = vfmadd213ps_fma(auVar190,local_a20,auVar221);
                auVar205._4_4_ = fVar212;
                auVar205._0_4_ = fVar212;
                auVar205._8_4_ = fVar212;
                auVar205._12_4_ = fVar212;
                auVar139 = vfmadd213ps_fma(auVar205,local_a30,auVar139);
                auVar261._4_4_ = fVar201;
                auVar261._0_4_ = fVar201;
                auVar261._8_4_ = fVar201;
                auVar261._12_4_ = fVar201;
                auVar165 = vfmadd213ps_fma(auVar261,local_a10,auVar139);
                auVar139 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_a60._0_16_,auVar244)
                ;
                auVar3 = vfmadd231ss_fma(local_a60._0_16_,auVar244,SUB6416(ZEXT464(0xc0000000),0));
                fVar201 = auVar244._0_4_;
                auVar191._0_4_ = (float)local_a40._0_4_ * fVar201;
                auVar191._4_4_ = (float)local_a40._4_4_ * fVar201;
                auVar191._8_4_ = fStack_a38 * fVar201;
                auVar191._12_4_ = fStack_a34 * fVar201;
                uVar100 = auVar3._0_4_;
                auVar206._4_4_ = uVar100;
                auVar206._0_4_ = uVar100;
                auVar206._8_4_ = uVar100;
                auVar206._12_4_ = uVar100;
                auVar244 = vfmadd213ps_fma(auVar206,local_a20,auVar191);
                auVar168._0_4_ = auVar139._0_4_;
                auVar168._4_4_ = auVar168._0_4_;
                auVar168._8_4_ = auVar168._0_4_;
                auVar168._12_4_ = auVar168._0_4_;
                auVar244 = vfmadd213ps_fma(auVar168,local_a30,auVar244);
                auVar144 = vfmadd231ps_fma(auVar244,local_a10,auVar113);
                auVar139 = vdpps_avx(auVar165,auVar165,0x7f);
                auVar244 = vblendps_avx(auVar139,_DAT_01feba10,0xe);
                auVar3 = vrsqrtss_avx(auVar244,auVar244);
                fVar201 = auVar3._0_4_;
                fVar213 = auVar139._0_4_;
                fVar201 = fVar201 * 1.5 + fVar213 * -0.5 * fVar201 * fVar201 * fVar201;
                auVar3 = vdpps_avx(auVar165,auVar144,0x7f);
                auVar169._0_4_ = auVar144._0_4_ * fVar213;
                auVar169._4_4_ = auVar144._4_4_ * fVar213;
                auVar169._8_4_ = auVar144._8_4_ * fVar213;
                auVar169._12_4_ = auVar144._12_4_ * fVar213;
                fVar212 = auVar3._0_4_;
                auVar222._0_4_ = auVar165._0_4_ * fVar212;
                auVar222._4_4_ = auVar165._4_4_ * fVar212;
                fVar215 = auVar165._8_4_;
                auVar222._8_4_ = fVar215 * fVar212;
                fVar214 = auVar165._12_4_;
                auVar222._12_4_ = fVar214 * fVar212;
                auVar3 = vsubps_avx(auVar169,auVar222);
                auVar244 = vrcpss_avx(auVar244,auVar244);
                auVar144 = vfnmadd213ss_fma(auVar244,auVar139,ZEXT416(0x40000000));
                fVar212 = auVar244._0_4_ * auVar144._0_4_;
                auVar244 = vmaxss_avx(ZEXT416((uint)local_820._0_4_),
                                      ZEXT416((uint)(auVar256._0_4_ * (float)local_920._0_4_)));
                auVar177 = ZEXT1664(auVar244);
                auVar229._0_8_ = auVar165._0_8_ ^ 0x8000000080000000;
                auVar229._8_4_ = -fVar215;
                auVar229._12_4_ = -fVar214;
                auVar192._0_4_ = fVar201 * auVar3._0_4_ * fVar212;
                auVar192._4_4_ = fVar201 * auVar3._4_4_ * fVar212;
                auVar192._8_4_ = fVar201 * auVar3._8_4_ * fVar212;
                auVar192._12_4_ = fVar201 * auVar3._12_4_ * fVar212;
                auVar246._0_4_ = auVar165._0_4_ * fVar201;
                auVar246._4_4_ = auVar165._4_4_ * fVar201;
                auVar246._8_4_ = fVar215 * fVar201;
                auVar246._12_4_ = fVar214 * fVar201;
                local_a60._0_16_ = auVar165;
                local_9e0._0_4_ = auVar244._0_4_;
                if (fVar213 < -fVar213) {
                  local_a00._0_4_ = auVar112._0_4_;
                  local_940._0_16_ = auVar229;
                  local_860._0_16_ = auVar246;
                  local_980._0_16_ = auVar192;
                  fVar201 = sqrtf(fVar213);
                  auVar177 = ZEXT464((uint)local_9e0._0_4_);
                  auVar112 = ZEXT416((uint)local_a00._0_4_);
                  auVar192 = local_980._0_16_;
                  auVar229 = local_940._0_16_;
                  auVar246 = local_860._0_16_;
                }
                else {
                  auVar244 = vsqrtss_avx(auVar139,auVar139);
                  fVar201 = auVar244._0_4_;
                }
                auVar244 = vdpps_avx(_local_960,auVar246,0x7f);
                auVar165 = vfmadd213ss_fma(ZEXT416((uint)local_820._0_4_),auVar112,auVar177._0_16_);
                auVar256 = vdpps_avx(auVar229,auVar246,0x7f);
                auVar139 = vdpps_avx(_local_960,auVar192,0x7f);
                auVar3 = vdpps_avx(local_900._0_16_,auVar246,0x7f);
                auVar165 = vfmadd213ss_fma(ZEXT416((uint)(auVar112._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_820._0_4_ / fVar201)),
                                           auVar165);
                auVar273 = ZEXT1664(auVar165);
                fVar201 = auVar256._0_4_ + auVar139._0_4_;
                auVar114._0_4_ = auVar244._0_4_ * auVar244._0_4_;
                auVar114._4_4_ = auVar244._4_4_ * auVar244._4_4_;
                auVar114._8_4_ = auVar244._8_4_ * auVar244._8_4_;
                auVar114._12_4_ = auVar244._12_4_ * auVar244._12_4_;
                auVar112 = vdpps_avx(_local_960,auVar229,0x7f);
                auVar139 = vsubps_avx(local_ac0._0_16_,auVar114);
                auVar256 = vrsqrtss_avx(auVar139,auVar139);
                fVar213 = auVar139._0_4_;
                fVar212 = auVar256._0_4_;
                fVar212 = fVar212 * 1.5 + fVar213 * -0.5 * fVar212 * fVar212 * fVar212;
                auVar256 = vdpps_avx(_local_960,local_900._0_16_,0x7f);
                auVar112 = vfnmadd231ss_fma(auVar112,auVar244,ZEXT416((uint)fVar201));
                auVar256 = vfnmadd231ss_fma(auVar256,auVar244,auVar3);
                if (fVar213 < 0.0) {
                  local_a00._0_16_ = auVar244;
                  local_940._0_4_ = auVar165._0_4_;
                  local_860._0_16_ = ZEXT416((uint)fVar201);
                  local_980._0_16_ = auVar3;
                  local_8a0._0_16_ = auVar112;
                  local_8c0._0_4_ = fVar212;
                  local_6e0._0_16_ = auVar256;
                  fVar213 = sqrtf(fVar213);
                  auVar273 = ZEXT464((uint)local_940._0_4_);
                  auVar177 = ZEXT464((uint)local_9e0._0_4_);
                  fVar212 = (float)local_8c0._0_4_;
                  auVar256 = local_6e0._0_16_;
                  auVar244 = local_a00._0_16_;
                  auVar3 = local_980._0_16_;
                  auVar112 = local_8a0._0_16_;
                  auVar139 = local_860._0_16_;
                }
                else {
                  auVar139 = vsqrtss_avx(auVar139,auVar139);
                  fVar213 = auVar139._0_4_;
                  auVar139 = ZEXT416((uint)fVar201);
                }
                auVar264 = ZEXT1664(auVar244);
                auVar234 = ZEXT1664(local_a60._0_16_);
                auVar144 = vpermilps_avx(local_6c0._0_16_,0xff);
                auVar165 = vshufps_avx(local_a60._0_16_,local_a60._0_16_,0xff);
                auVar4 = vfmsub213ss_fma(auVar112,ZEXT416((uint)fVar212),auVar165);
                auVar294 = ZEXT1664(auVar4);
                auVar193._0_8_ = auVar3._0_8_ ^ 0x8000000080000000;
                auVar193._8_4_ = auVar3._8_4_ ^ 0x80000000;
                auVar193._12_4_ = auVar3._12_4_ ^ 0x80000000;
                auVar207._0_8_ = auVar4._0_8_ ^ 0x8000000080000000;
                auVar207._8_4_ = auVar4._8_4_ ^ 0x80000000;
                auVar207._12_4_ = auVar4._12_4_ ^ 0x80000000;
                auVar112 = ZEXT416((uint)(auVar256._0_4_ * fVar212));
                auVar256 = vfmsub231ss_fma(ZEXT416((uint)(auVar3._0_4_ * auVar4._0_4_)),auVar139,
                                           auVar112);
                auVar112 = vinsertps_avx(auVar112,auVar193,0x10);
                uVar100 = auVar256._0_4_;
                auVar194._4_4_ = uVar100;
                auVar194._0_4_ = uVar100;
                auVar194._8_4_ = uVar100;
                auVar194._12_4_ = uVar100;
                auVar112 = vdivps_avx(auVar112,auVar194);
                auVar144 = ZEXT416((uint)(fVar213 - auVar144._0_4_));
                auVar3 = vinsertps_avx(auVar244,auVar144,0x10);
                auVar225 = ZEXT1664(auVar3);
                auVar170._0_4_ = auVar3._0_4_ * auVar112._0_4_;
                auVar170._4_4_ = auVar3._4_4_ * auVar112._4_4_;
                auVar170._8_4_ = auVar3._8_4_ * auVar112._8_4_;
                auVar170._12_4_ = auVar3._12_4_ * auVar112._12_4_;
                auVar112 = vinsertps_avx(auVar207,auVar139,0x1c);
                auVar112 = vdivps_avx(auVar112,auVar194);
                auVar195._0_4_ = auVar3._0_4_ * auVar112._0_4_;
                auVar195._4_4_ = auVar3._4_4_ * auVar112._4_4_;
                auVar195._8_4_ = auVar3._8_4_ * auVar112._8_4_;
                auVar195._12_4_ = auVar3._12_4_ * auVar112._12_4_;
                auVar112 = vhaddps_avx(auVar170,auVar170);
                auVar256 = vhaddps_avx(auVar195,auVar195);
                fVar212 = (float)local_ae0._0_4_ - auVar112._0_4_;
                auVar248 = ZEXT464((uint)fVar212);
                fVar201 = (float)local_b00._0_4_ - auVar256._0_4_;
                auVar259 = ZEXT464((uint)fVar201);
                auVar112 = vandps_avx(auVar244,local_840._0_16_);
                if (auVar273._0_4_ <= auVar112._0_4_) {
LAB_0183d886:
                  bVar65 = false;
                }
                else {
                  auVar256 = vfmadd231ss_fma(ZEXT416((uint)(auVar177._0_4_ + auVar273._0_4_)),
                                             local_700._0_16_,ZEXT416(0x36000000));
                  auVar112 = vandps_avx(auVar144,local_840._0_16_);
                  if (auVar256._0_4_ <= auVar112._0_4_) goto LAB_0183d886;
                  fVar201 = fVar201 + (float)local_7f0._0_4_;
                  auVar259 = ZEXT464((uint)fVar201);
                  bVar65 = true;
                  if (((((ray->super_RayK<1>).org.field_0.m128[3] <= fVar201) &&
                       (fVar213 = (ray->super_RayK<1>).tfar, fVar201 <= fVar213)) &&
                      (0.0 <= fVar212)) && (fVar212 <= 1.0)) {
                    auVar112 = vrsqrtss_avx(local_ac0._0_16_,local_ac0._0_16_);
                    fVar215 = auVar112._0_4_;
                    pGVar7 = (context->scene->geometries).items[local_b08].ptr;
                    if ((pGVar7->mask & (ray->super_RayK<1>).mask) != 0) {
                      fVar215 = fVar215 * 1.5 + local_ac0._0_4_ * -0.5 * fVar215 * fVar215 * fVar215
                      ;
                      auVar145._0_4_ = fVar215 * (float)local_960._0_4_;
                      auVar145._4_4_ = fVar215 * (float)local_960._4_4_;
                      auVar145._8_4_ = fVar215 * fStack_958;
                      auVar145._12_4_ = fVar215 * fStack_954;
                      auVar165 = vfmadd213ps_fma(auVar165,auVar145,local_a60._0_16_);
                      auVar112 = vshufps_avx(auVar145,auVar145,0xc9);
                      auVar256 = vshufps_avx(local_a60._0_16_,local_a60._0_16_,0xc9);
                      auVar146._0_4_ = auVar145._0_4_ * auVar256._0_4_;
                      auVar146._4_4_ = auVar145._4_4_ * auVar256._4_4_;
                      auVar146._8_4_ = auVar145._8_4_ * auVar256._8_4_;
                      auVar146._12_4_ = auVar145._12_4_ * auVar256._12_4_;
                      auVar139 = vfmsub231ps_fma(auVar146,local_a60._0_16_,auVar112);
                      auVar112 = vshufps_avx(auVar139,auVar139,0xc9);
                      auVar256 = vshufps_avx(auVar165,auVar165,0xc9);
                      auVar139 = vshufps_avx(auVar139,auVar139,0xd2);
                      auVar115._0_4_ = auVar165._0_4_ * auVar139._0_4_;
                      auVar115._4_4_ = auVar165._4_4_ * auVar139._4_4_;
                      auVar115._8_4_ = auVar165._8_4_ * auVar139._8_4_;
                      auVar115._12_4_ = auVar165._12_4_ * auVar139._12_4_;
                      auVar112 = vfmsub231ps_fma(auVar115,auVar112,auVar256);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        (ray->super_RayK<1>).tfar = fVar201;
                        auVar244 = vshufps_avx(auVar112,auVar112,0xe9);
                        uVar227 = vmovlps_avx(auVar244);
                        *(undefined8 *)&(ray->Ng).field_0 = uVar227;
                        (ray->Ng).field_0.field_0.z = auVar112._0_4_;
                        ray->u = fVar212;
                        ray->v = 0.0;
                        ray->primID = uVar98;
                        ray->geomID = (uint)local_b08;
                        ray->instID[0] = context->user->instID[0];
                        ray->instPrimID[0] = context->user->instPrimID[0];
                      }
                      else {
                        auVar256 = vshufps_avx(auVar112,auVar112,0xe9);
                        local_9b0 = vmovlps_avx(auVar256);
                        local_9a8 = auVar112._0_4_;
                        local_9a4 = fVar212;
                        local_9a0 = 0;
                        local_99c = uVar98;
                        local_998 = (uint)local_b08;
                        local_994 = context->user->instID[0];
                        local_990 = context->user->instPrimID[0];
                        (ray->super_RayK<1>).tfar = fVar201;
                        local_b0c = -1;
                        local_a90.valid = &local_b0c;
                        local_a90.geometryUserPtr = pGVar7->userPtr;
                        local_a90.context = context->user;
                        local_a90.ray = (RTCRayN *)ray;
                        local_a90.hit = (RTCHitN *)&local_9b0;
                        local_a90.N = 1;
                        local_ae0._0_16_ = ZEXT416((uint)fVar212);
                        local_b00._0_16_ = ZEXT416((uint)fVar201);
                        local_ac0._0_4_ = fVar213;
                        if (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0183d9aa:
                          p_Var8 = context->args->filter;
                          if (p_Var8 != (RTCFilterFunctionN)0x0) {
                            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar7->field_8).field_0x2 & 0x40) != 0)) {
                              auVar225 = ZEXT1664(auVar225._0_16_);
                              auVar234 = ZEXT1664(auVar234._0_16_);
                              auVar264 = ZEXT1664(auVar264._0_16_);
                              auVar273 = ZEXT1664(auVar273._0_16_);
                              auVar294 = ZEXT1664(auVar294._0_16_);
                              (*p_Var8)(&local_a90);
                              auVar259 = ZEXT1664(local_b00._0_16_);
                              auVar248 = ZEXT1664(local_ae0._0_16_);
                              fVar213 = (float)local_ac0._0_4_;
                            }
                            if (*local_a90.valid == 0) goto LAB_0183da4e;
                          }
                          (((Vec3f *)((long)local_a90.ray + 0x30))->field_0).components[0] =
                               *(float *)local_a90.hit;
                          (((Vec3f *)((long)local_a90.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_a90.hit + 4);
                          (((Vec3f *)((long)local_a90.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_a90.hit + 8);
                          *(float *)((long)local_a90.ray + 0x3c) = *(float *)(local_a90.hit + 0xc);
                          *(float *)((long)local_a90.ray + 0x40) = *(float *)(local_a90.hit + 0x10);
                          *(float *)((long)local_a90.ray + 0x44) = *(float *)(local_a90.hit + 0x14);
                          *(float *)((long)local_a90.ray + 0x48) = *(float *)(local_a90.hit + 0x18);
                          *(float *)((long)local_a90.ray + 0x4c) = *(float *)(local_a90.hit + 0x1c);
                          *(float *)((long)local_a90.ray + 0x50) = *(float *)(local_a90.hit + 0x20);
                        }
                        else {
                          auVar225 = ZEXT1664(auVar3);
                          auVar234 = ZEXT1664(local_a60._0_16_);
                          auVar264 = ZEXT1664(auVar244);
                          auVar273 = ZEXT1664(auVar273._0_16_);
                          auVar294 = ZEXT1664(auVar4);
                          (*pGVar7->intersectionFilterN)(&local_a90);
                          auVar259 = ZEXT1664(local_b00._0_16_);
                          auVar248 = ZEXT1664(local_ae0._0_16_);
                          fVar213 = (float)local_ac0._0_4_;
                          if (*local_a90.valid != 0) goto LAB_0183d9aa;
LAB_0183da4e:
                          (ray->super_RayK<1>).tfar = fVar213;
                        }
                      }
                    }
                  }
                }
                auVar124 = local_620;
                bVar103 = lVar102 != 0;
                lVar102 = lVar102 + -1;
              } while ((!bVar65) && (bVar103));
              fVar201 = (ray->super_RayK<1>).tfar;
              auVar126._4_4_ = fVar201;
              auVar126._0_4_ = fVar201;
              auVar126._8_4_ = fVar201;
              auVar126._12_4_ = fVar201;
              auVar126._16_4_ = fVar201;
              auVar126._20_4_ = fVar201;
              auVar126._24_4_ = fVar201;
              auVar126._28_4_ = fVar201;
              auVar75._4_4_ = fStack_73c;
              auVar75._0_4_ = local_740;
              auVar75._8_4_ = fStack_738;
              auVar75._12_4_ = fStack_734;
              auVar75._16_4_ = fStack_730;
              auVar75._20_4_ = fStack_72c;
              auVar75._24_4_ = fStack_728;
              auVar75._28_4_ = fStack_724;
              auVar116 = vcmpps_avx(auVar75,auVar126,2);
              local_620 = vandps_avx(auVar116,local_620);
              auVar124 = auVar124 & auVar116;
              uVar101 = local_660._0_8_;
            } while ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar124 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar124 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar124 >> 0x7f,0) != '\0') ||
                       (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar124 >> 0xbf,0) != '\0') ||
                     (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar124[0x1f] < '\0');
          }
          auVar158._0_4_ = (float)local_760._0_4_ + local_4a0._0_4_;
          auVar158._4_4_ = (float)local_760._4_4_ + local_4a0._4_4_;
          auVar158._8_4_ = fStack_758 + local_4a0._8_4_;
          auVar158._12_4_ = fStack_754 + local_4a0._12_4_;
          auVar158._16_4_ = fStack_750 + local_4a0._16_4_;
          auVar158._20_4_ = fStack_74c + local_4a0._20_4_;
          auVar158._24_4_ = fStack_748 + local_4a0._24_4_;
          auVar158._28_4_ = fStack_744 + local_4a0._28_4_;
          fVar201 = (ray->super_RayK<1>).tfar;
          auVar199._4_4_ = fVar201;
          auVar199._0_4_ = fVar201;
          auVar199._8_4_ = fVar201;
          auVar199._12_4_ = fVar201;
          auVar199._16_4_ = fVar201;
          auVar199._20_4_ = fVar201;
          auVar199._24_4_ = fVar201;
          auVar199._28_4_ = fVar201;
          auVar116 = vcmpps_avx(auVar158,auVar199,2);
          auVar124 = vandps_avx(local_5c0,local_5a0);
          auVar124 = vandps_avx(auVar116,auVar124);
          auVar210._0_4_ = (float)local_760._0_4_ + local_4e0._0_4_;
          auVar210._4_4_ = (float)local_760._4_4_ + local_4e0._4_4_;
          auVar210._8_4_ = fStack_758 + local_4e0._8_4_;
          auVar210._12_4_ = fStack_754 + local_4e0._12_4_;
          auVar210._16_4_ = fStack_750 + local_4e0._16_4_;
          auVar210._20_4_ = fStack_74c + local_4e0._20_4_;
          auVar210._24_4_ = fStack_748 + local_4e0._24_4_;
          auVar210._28_4_ = fStack_744 + local_4e0._28_4_;
          auVar9 = vcmpps_avx(auVar210,auVar199,2);
          auVar116 = vandps_avx(_local_7a0,local_780);
          auVar116 = vandps_avx(auVar9,auVar116);
          auVar116 = vorps_avx(auVar124,auVar116);
          if ((((((((auVar116 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar116 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar116 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar116 >> 0x7f,0) != '\0') ||
                (auVar116 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar116 >> 0xbf,0) != '\0') ||
              (auVar116 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar116[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar97 * 0x60) = auVar116;
            auVar124 = vblendvps_avx(_local_4e0,local_4a0,auVar124);
            *(undefined1 (*) [32])(auStack_160 + uVar97 * 0x60) = auVar124;
            auVar74._8_8_ = uStack_7f8;
            auVar74._0_8_ = local_800;
            uVar227 = vmovlps_avx(auVar74);
            *(undefined8 *)(afStack_140 + uVar97 * 0x18) = uVar227;
            auStack_138[uVar97 * 0x18] = (int)uVar101 + 1;
            uVar97 = (ulong)((int)uVar97 + 1);
          }
        }
      }
    }
    fVar201 = (ray->super_RayK<1>).tfar;
    auVar127._4_4_ = fVar201;
    auVar127._0_4_ = fVar201;
    auVar127._8_4_ = fVar201;
    auVar127._12_4_ = fVar201;
    auVar127._16_4_ = fVar201;
    auVar127._20_4_ = fVar201;
    auVar127._24_4_ = fVar201;
    auVar127._28_4_ = fVar201;
    do {
      if ((int)uVar97 == 0) {
        fVar201 = (ray->super_RayK<1>).tfar;
        auVar129._4_4_ = fVar201;
        auVar129._0_4_ = fVar201;
        auVar129._8_4_ = fVar201;
        auVar129._12_4_ = fVar201;
        auVar129._16_4_ = fVar201;
        auVar129._20_4_ = fVar201;
        auVar129._24_4_ = fVar201;
        auVar129._28_4_ = fVar201;
        auVar124 = vcmpps_avx(local_260,auVar129,2);
        uVar98 = vmovmskps_avx(auVar124);
        uVar98 = (uint)local_7c8 & uVar98;
        if (uVar98 == 0) {
          return;
        }
        goto LAB_0183b637;
      }
      uVar99 = (ulong)((int)uVar97 - 1);
      lVar102 = uVar99 * 0x60;
      auVar124 = *(undefined1 (*) [32])(auStack_160 + lVar102);
      auVar159._0_4_ = auVar124._0_4_ + (float)local_760._0_4_;
      auVar159._4_4_ = auVar124._4_4_ + (float)local_760._4_4_;
      auVar159._8_4_ = auVar124._8_4_ + fStack_758;
      auVar159._12_4_ = auVar124._12_4_ + fStack_754;
      auVar159._16_4_ = auVar124._16_4_ + fStack_750;
      auVar159._20_4_ = auVar124._20_4_ + fStack_74c;
      auVar159._24_4_ = auVar124._24_4_ + fStack_748;
      auVar159._28_4_ = auVar124._28_4_ + fStack_744;
      auVar9 = vcmpps_avx(auVar159,auVar127,2);
      auVar116 = vandps_avx(auVar9,*(undefined1 (*) [32])(auStack_180 + lVar102));
      local_4a0 = auVar116;
      auVar9 = *(undefined1 (*) [32])(auStack_180 + lVar102) & auVar9;
      bVar71 = (auVar9 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar72 = (auVar9 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar70 = (auVar9 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar69 = SUB321(auVar9 >> 0x7f,0) == '\0';
      bVar68 = (auVar9 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar67 = SUB321(auVar9 >> 0xbf,0) == '\0';
      bVar103 = (auVar9 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar65 = -1 < auVar9[0x1f];
      if (((((((!bVar71 || !bVar72) || !bVar70) || !bVar69) || !bVar68) || !bVar67) || !bVar103) ||
          !bVar65) {
        auVar200._8_4_ = 0x7f800000;
        auVar200._0_8_ = 0x7f8000007f800000;
        auVar200._12_4_ = 0x7f800000;
        auVar200._16_4_ = 0x7f800000;
        auVar200._20_4_ = 0x7f800000;
        auVar200._24_4_ = 0x7f800000;
        auVar200._28_4_ = 0x7f800000;
        auVar124 = vblendvps_avx(auVar200,auVar124,auVar116);
        auVar9 = vshufps_avx(auVar124,auVar124,0xb1);
        auVar9 = vminps_avx(auVar124,auVar9);
        auVar10 = vshufpd_avx(auVar9,auVar9,5);
        auVar9 = vminps_avx(auVar9,auVar10);
        auVar10 = vpermpd_avx2(auVar9,0x4e);
        auVar9 = vminps_avx(auVar9,auVar10);
        auVar124 = vcmpps_avx(auVar124,auVar9,0);
        auVar9 = auVar116 & auVar124;
        if ((((((((auVar9 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar9 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar9 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar9 >> 0x7f,0) != '\0') ||
              (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar9 >> 0xbf,0) != '\0') ||
            (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar9[0x1f] < '\0') {
          auVar116 = vandps_avx(auVar124,auVar116);
        }
        fVar201 = afStack_140[uVar99 * 0x18 + 1];
        uVar101 = (ulong)auStack_138[uVar99 * 0x18];
        uVar96 = vmovmskps_avx(auVar116);
        iVar14 = 0;
        for (; (uVar96 & 1) == 0; uVar96 = uVar96 >> 1 | 0x80000000) {
          iVar14 = iVar14 + 1;
        }
        fVar212 = afStack_140[uVar99 * 0x18];
        auVar160._4_4_ = fVar212;
        auVar160._0_4_ = fVar212;
        auVar160._8_4_ = fVar212;
        auVar160._12_4_ = fVar212;
        auVar160._16_4_ = fVar212;
        auVar160._20_4_ = fVar212;
        auVar160._24_4_ = fVar212;
        auVar160._28_4_ = fVar212;
        *(undefined4 *)(local_4a0 + (uint)(iVar14 << 2)) = 0;
        *(undefined1 (*) [32])(auStack_180 + lVar102) = local_4a0;
        if ((((((((local_4a0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (local_4a0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_4a0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(local_4a0 >> 0x7f,0) != '\0') ||
              (local_4a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(local_4a0 >> 0xbf,0) != '\0') ||
            (local_4a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_4a0[0x1f] < '\0') {
          uVar99 = uVar97;
        }
        fVar201 = fVar201 - fVar212;
        auVar176._4_4_ = fVar201;
        auVar176._0_4_ = fVar201;
        auVar176._8_4_ = fVar201;
        auVar176._12_4_ = fVar201;
        auVar176._16_4_ = fVar201;
        auVar176._20_4_ = fVar201;
        auVar176._24_4_ = fVar201;
        auVar176._28_4_ = fVar201;
        auVar112 = vfmadd132ps_fma(auVar176,auVar160,_DAT_02020f20);
        _local_4e0 = ZEXT1632(auVar112);
        local_800 = *(undefined8 *)(local_4e0 + (uint)(iVar14 << 2));
        uStack_7f8 = 0;
      }
      uVar97 = uVar99;
    } while (((((((bVar71 && bVar72) && bVar70) && bVar69) && bVar68) && bVar67) && bVar103) &&
             bVar65);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersector1<M>::intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }